

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NewFrame(void)

{
  ImVec2 *pIVar1;
  ImGuiNavMoveResult *pIVar2;
  ImGuiNextWindowData *pIVar3;
  int *piVar4;
  float *pfVar5;
  ImVec2 *pIVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ImGuiContextHook *pIVar11;
  ImFontAtlas *pIVar12;
  ImGuiPlatformMonitor *pIVar13;
  uint *puVar14;
  _func_bool_ImGuiViewport_ptr *p_Var15;
  ImGuiWindow **ppIVar16;
  ImGuiViewport **ppIVar17;
  ImGuiViewportP *pIVar18;
  _func_float_ImGuiViewport_ptr *p_Var19;
  _func_void_ImGuiViewport_ptr *p_Var20;
  ImGuiPopupData *pIVar21;
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  byte bVar24;
  ImGuiContext *ctx_00;
  ImGuiContext *pIVar25;
  ImGuiID IVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  undefined4 extraout_EAX;
  ImGuiID IVar31;
  ImGuiInputSource IVar32;
  ImGuiContext *g_4;
  uint *__dest;
  ImGuiViewport **ppIVar33;
  ImGuiWindow *pIVar34;
  ImGuiWindow **__dest_00;
  ImGuiPopupData *__dest_01;
  int i;
  ImGuiID IVar35;
  ImGuiViewportP *pIVar36;
  ImGuiWindow *window_00;
  char *pcVar37;
  ImGuiWindow *parent;
  ImGuiWindow *pIVar38;
  ImGuiContext *g;
  int i_1;
  ImGuiDir IVar39;
  ImRect *pIVar40;
  ImGuiID IVar41;
  ulong uVar42;
  float *pfVar43;
  ImGuiNavLayer IVar44;
  ImGuiID IVar45;
  ImGuiViewportP **ppIVar46;
  ImFont *font;
  float *pfVar47;
  long lVar48;
  ImGuiViewportP *pIVar49;
  long lVar50;
  ImGuiContext *ctx;
  ImGuiContext *g_2;
  ImGuiNavMoveResult *pIVar51;
  ImGuiWindow *window;
  long lVar52;
  bool *pbVar53;
  ImGuiContext *pIVar54;
  ImGuiWindow *old_nav_window;
  long lVar55;
  ImGuiContext *pIVar56;
  ulong uVar57;
  byte bVar58;
  int iVar59;
  uint uVar60;
  int iVar61;
  int iVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  float fVar66;
  ImVec2 IVar67;
  ImVec2 IVar68;
  ImVec2 IVar69;
  ImVec2 IVar71;
  undefined1 auVar73 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar74 [16];
  ImVec4 IVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  double dVar70;
  undefined1 auVar78 [16];
  float fVar79;
  ImVec2 IVar80;
  ImVec4 IVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  float fVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar91;
  float fVar93;
  float fVar94;
  undefined1 auVar92 [16];
  ImRect local_68;
  ImVec2 local_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 auVar72 [16];
  
  ctx_00 = GImGui;
  bVar58 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0xf57,"void ImGui::NewFrame()");
  }
  iVar59 = (GImGui->Hooks).Size;
  if (0 < iVar59) {
    lVar52 = 0;
    lVar55 = 0;
    do {
      pIVar11 = (ctx_00->Hooks).Data;
      if (*(int *)(pIVar11 + lVar52) == 0) {
        (**(code **)(pIVar11 + lVar52 + 8))(ctx_00,pIVar11 + lVar52);
        iVar59 = (ctx_00->Hooks).Size;
      }
      lVar55 = lVar55 + 1;
      lVar52 = lVar52 + 0x18;
    } while (lVar55 < iVar59);
  }
  pIVar54 = GImGui;
  ctx_00->ConfigFlagsLastFrame = ctx_00->ConfigFlagsCurrFrame;
  if (pIVar54->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d8b,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  iVar59 = pIVar54->FrameCount;
  if ((pIVar54->IO).DeltaTime <= 0.0) {
    if (iVar59 != 0) {
      __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1d8c,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
LAB_001246f9:
    iVar59 = 0;
    bVar27 = true;
  }
  else {
    if (iVar59 == 0) goto LAB_001246f9;
    if (pIVar54->FrameCountEnded != iVar59) {
      __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1d8d,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    bVar27 = false;
  }
  if (((pIVar54->IO).DisplaySize.x < 0.0) || ((pIVar54->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d8e,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar12 = (pIVar54->IO).Fonts;
  if ((pIVar12->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d8f,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((*(pIVar12->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d90,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((pIVar54->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d91,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((pIVar54->Style).CircleSegmentMaxError <= 0.0) {
    __assert_fail("g.Style.CircleSegmentMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d92,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar66 = (pIVar54->Style).Alpha;
  if ((fVar66 < 0.0) || (1.0 < fVar66)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d93,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((pIVar54->Style).WindowMinSize.x < 1.0) || ((pIVar54->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d94,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (pIVar54->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d95,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar52 = 0;
  do {
    if (0x200 < (pIVar54->IO).KeyMap[lVar52] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown)))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1d97,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    lVar52 = lVar52 + 1;
  } while (lVar52 != 0x16);
  uVar60 = (pIVar54->IO).ConfigFlags;
  if (((uVar60 & 1) != 0) && ((pIVar54->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1d9b,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((pIVar54->IO).ConfigWindowsResizeFromEdges == true) &&
     (((pIVar54->IO).BackendFlags & 2) == 0)) {
    (pIVar54->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (iVar59 == 1) {
    if (((uVar60 & 0x40) != 0) && ((pIVar54->ConfigFlagsLastFrame & 0x40) == 0)) {
      __assert_fail("0 && \"Please set DockingEnable before the first call to NewFrame()! Otherwise you will lose your .ini settings!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1da3,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((uVar60 >> 10 & 1) == 0) goto LAB_00124a11;
    if ((pIVar54->ConfigFlagsLastFrame & 0x400) == 0) {
      __assert_fail("0 && \"Please set ViewportsEnable before the first call to NewFrame()! Otherwise you will lose your .ini settings!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1da5,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
LAB_00124869:
    if ((~(pIVar54->IO).BackendFlags & 0x1400U) != 0) {
      (pIVar54->IO).ConfigFlags = uVar60 & 0xfffffbff;
      uVar63 = (pIVar54->PlatformIO).Monitors.Size;
      if (0 < (int)uVar63) goto LAB_0012496a;
      goto LAB_00124a11;
    }
    if ((!bVar27) && (iVar59 != pIVar54->FrameCountPlatformEnded)) {
      __assert_fail("(g.FrameCount == 0 || g.FrameCount == g.FrameCountPlatformEnded) && \"Forgot to call UpdatePlatformWindows() in main loop after EndFrame()? Check examples/ applications for reference.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1dac,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar54->PlatformIO).Platform_CreateWindow == (_func_void_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_CreateWindow != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1dad,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar54->PlatformIO).Platform_DestroyWindow == (_func_void_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_DestroyWindow != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1dae,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar54->PlatformIO).Platform_GetWindowPos == (_func_ImVec2_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_GetWindowPos != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1daf,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar54->PlatformIO).Platform_SetWindowPos == (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0) {
      __assert_fail("g.PlatformIO.Platform_SetWindowPos != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1db0,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar54->PlatformIO).Platform_GetWindowSize == (_func_ImVec2_ImGuiViewport_ptr *)0x0) {
      __assert_fail("g.PlatformIO.Platform_GetWindowSize != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1db1,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((pIVar54->PlatformIO).Platform_SetWindowSize == (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0)
    {
      __assert_fail("g.PlatformIO.Platform_SetWindowSize != __null && \"Platform init didn\'t install handlers?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1db2,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    uVar63 = (pIVar54->PlatformIO).Monitors.Size;
    if ((int)uVar63 < 1) {
      __assert_fail("g.PlatformIO.Monitors.Size > 0 && \"Platform init didn\'t setup Monitors list?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1db3,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if (0 < (pIVar54->Viewports).Size) {
      pIVar49 = *(pIVar54->Viewports).Data;
      if (((pIVar49->super_ImGuiViewport).PlatformUserData == (void *)0x0) &&
         ((pIVar49->super_ImGuiViewport).PlatformHandle == (void *)0x0)) {
        __assert_fail("(g.Viewports[0]->PlatformUserData != __null || g.Viewports[0]->PlatformHandle != __null) && \"Platform init didn\'t setup main viewport.\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x1db4,"void ImGui::ErrorCheckNewFrameSanityChecks()");
      }
      if ((((uVar60 & 0x40) != 0) && ((pIVar54->IO).ConfigDockingTransparentPayload != false)) &&
         ((pIVar54->PlatformIO).Platform_SetWindowAlpha == (_func_void_ImGuiViewport_ptr_float *)0x0
         )) {
        __assert_fail("g.PlatformIO.Platform_SetWindowAlpha != __null && \"Platform_SetWindowAlpha handler is required to use io.ConfigDockingTransparent!\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x1db6,"void ImGui::ErrorCheckNewFrameSanityChecks()");
      }
LAB_0012496a:
      pIVar13 = (pIVar54->PlatformIO).Monitors.Data;
      lVar52 = 0;
      do {
        uVar9 = *(undefined8 *)((long)&(pIVar13->MainSize).x + lVar52);
        fVar66 = (float)uVar9;
        if ((fVar66 <= 0.0) || (fVar84 = (float)((ulong)uVar9 >> 0x20), fVar84 <= 0.0)) {
          __assert_fail("mon.MainSize.x > 0.0f && mon.MainSize.y > 0.0f && \"Monitor main bounds not setup properly.\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x1dc2,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        uVar9 = *(undefined8 *)((long)&(pIVar13->MainPos).x + lVar52);
        uVar10 = *(undefined8 *)((long)&(pIVar13->WorkPos).x + lVar52);
        fVar91 = (float)uVar10;
        fVar94 = (float)uVar9;
        if (fVar91 < fVar94) {
LAB_00127e51:
          __assert_fail("ImRect(mon.MainPos, mon.MainPos + mon.MainSize).Contains(ImRect(mon.WorkPos, mon.WorkPos + mon.WorkSize)) && \"Monitor work bounds not setup properly. If you don\'t have work area information, just copy MainPos/MainSize into them.\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x1dc3,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        fVar93 = (float)((ulong)uVar9 >> 0x20);
        fVar85 = (float)((ulong)uVar10 >> 0x20);
        uVar60 = -(uint)(fVar93 <= fVar85);
        if ((uVar60 & 1) == 0) goto LAB_00127e51;
        uVar9 = *(undefined8 *)((long)&(pIVar13->WorkSize).x + lVar52);
        iVar59 = -(uint)(fVar91 + (float)uVar9 <= fVar66 + fVar94);
        iVar61 = -(uint)(fVar85 + (float)((ulong)uVar9 >> 0x20) <= fVar84 + fVar93);
        auVar83._4_4_ = iVar61;
        auVar83._0_4_ = iVar59;
        auVar83._8_4_ = iVar61;
        auVar83._12_4_ = iVar61;
        auVar86._8_8_ = auVar83._8_8_;
        auVar86._4_4_ = iVar59;
        auVar86._0_4_ = iVar59;
        uVar60 = movmskpd(uVar60 & 0xffff,auVar86);
        if (((uVar60 & 1) == 0) || ((byte)((byte)uVar60 >> 1) == 0)) goto LAB_00127e51;
        fVar66 = *(float *)((long)&pIVar13->DpiScale + lVar52);
        if ((fVar66 == 0.0) && (!NAN(fVar66))) {
          __assert_fail("mon.DpiScale != 0.0f",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x1dc4,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        lVar52 = lVar52 + 0x24;
      } while ((ulong)uVar63 * 0x24 != lVar52);
      goto LAB_00124a11;
    }
  }
  else {
    if ((uVar60 >> 10 & 1) != 0) goto LAB_00124869;
LAB_00124a11:
    ctx_00->ConfigFlagsCurrFrame = (ctx_00->IO).ConfigFlags;
    if (pIVar54->SettingsLoaded == false) {
      if ((pIVar54->SettingsWindows).Buf.Size != 0) {
        __assert_fail("g.SettingsWindows.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x297c,"void ImGui::UpdateSettings()");
      }
      pcVar37 = (pIVar54->IO).IniFilename;
      if (pcVar37 != (char *)0x0) {
        LoadIniSettingsFromDisk(pcVar37);
      }
      pIVar54->SettingsLoaded = true;
    }
    if ((0.0 < pIVar54->SettingsDirtyTimer) &&
       (fVar66 = pIVar54->SettingsDirtyTimer - (pIVar54->IO).DeltaTime,
       pIVar54->SettingsDirtyTimer = fVar66, fVar66 <= 0.0)) {
      pcVar37 = (pIVar54->IO).IniFilename;
      if (pcVar37 == (char *)0x0) {
        (pIVar54->IO).WantSaveIniSettings = true;
      }
      else {
        SaveIniSettingsToDisk(pcVar37);
      }
      pIVar54->SettingsDirtyTimer = 0.0;
    }
    fVar66 = (ctx_00->IO).DeltaTime;
    ctx_00->Time = (double)fVar66 + ctx_00->Time;
    ctx_00->WithinFrameScope = true;
    ctx_00->FrameCount = ctx_00->FrameCount + 1;
    ctx_00->TooltipOverrideCount = 0;
    ctx_00->WindowsActiveCount = 0;
    if ((ctx_00->MenusIdSubmittedThisFrame).Capacity < 0) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar4 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar4 = *piVar4 + 1;
      }
      __dest = (uint *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
      puVar14 = (ctx_00->MenusIdSubmittedThisFrame).Data;
      if (puVar14 != (uint *)0x0) {
        memcpy(__dest,puVar14,(long)(ctx_00->MenusIdSubmittedThisFrame).Size << 2);
        puVar14 = (ctx_00->MenusIdSubmittedThisFrame).Data;
        if ((puVar14 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar4 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar4 = *piVar4 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar14,GImAllocatorUserData);
      }
      (ctx_00->MenusIdSubmittedThisFrame).Data = __dest;
      (ctx_00->MenusIdSubmittedThisFrame).Capacity = 0;
      fVar66 = (ctx_00->IO).DeltaTime;
    }
    pIVar54 = GImGui;
    (ctx_00->MenusIdSubmittedThisFrame).Size = 0;
    iVar59 = ctx_00->FramerateSecPerFrameIdx;
    ctx_00->FramerateSecPerFrameAccum =
         (fVar66 - ctx_00->FramerateSecPerFrame[iVar59]) + ctx_00->FramerateSecPerFrameAccum;
    ctx_00->FramerateSecPerFrame[iVar59] = fVar66;
    iVar61 = iVar59 + (int)((ulong)((long)(iVar59 + 1) * -0x77777777) >> 0x20) + 1;
    ctx_00->FramerateSecPerFrameIdx = iVar59 + 1 + ((iVar61 >> 6) - (iVar61 >> 0x1f)) * -0x78;
    uVar60 = -(uint)(0.0 < ctx_00->FramerateSecPerFrameAccum);
    (ctx_00->IO).Framerate =
         (float)(~uVar60 & 0x7f7fffff |
                (uint)(1.0 / (ctx_00->FramerateSecPerFrameAccum / 120.0)) & uVar60);
    iVar59 = (pIVar54->Viewports).Size;
    if (iVar59 < (pIVar54->PlatformIO).Viewports.Size) {
      __assert_fail("g.PlatformIO.Viewports.Size <= g.Viewports.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x2b74,"void ImGui::UpdateViewportsNewFrame()");
    }
    uVar60 = pIVar54->ConfigFlagsCurrFrame;
    if ((uVar60 >> 10 & 1) != 0) {
      if (iVar59 < 1) goto LAB_00127e13;
      lVar52 = 0;
      do {
        p_Var15 = (pIVar54->PlatformIO).Platform_GetWindowMinimized;
        if ((p_Var15 != (_func_bool_ImGuiViewport_ptr *)0x0) &&
           (pIVar49 = (pIVar54->Viewports).Data[lVar52], pIVar49->PlatformWindowCreated == true)) {
          bVar27 = (*p_Var15)(&pIVar49->super_ImGuiViewport);
          (pIVar49->super_ImGuiViewport).Flags =
               (uint)bVar27 << 7 | (pIVar49->super_ImGuiViewport).Flags & 0xffffff7fU;
          iVar59 = (pIVar54->Viewports).Size;
        }
        lVar52 = lVar52 + 1;
      } while (lVar52 < iVar59);
    }
    if (0 < iVar59) {
      pIVar49 = *(pIVar54->Viewports).Data;
      if ((pIVar49->super_ImGuiViewport).ID != 0x11111111) {
        __assert_fail("main_viewport->ID == IMGUI_VIEWPORT_DEFAULT_ID",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x2b8c,"void ImGui::UpdateViewportsNewFrame()");
      }
      if (pIVar49->Window != (ImGuiWindow *)0x0) {
        __assert_fail("main_viewport->Window == __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x2b8d,"void ImGui::UpdateViewportsNewFrame()");
      }
      if ((uVar60 >> 10 & 1) == 0) {
        local_68.Min.x = 0.0;
        local_68.Min.y = 0.0;
        local_50 = (pIVar54->IO).DisplaySize;
      }
      else {
        local_68.Min = (*(pIVar54->PlatformIO).Platform_GetWindowPos)(&pIVar49->super_ImGuiViewport)
        ;
        local_50 = (pIVar54->IO).DisplaySize;
        if (((pIVar49->super_ImGuiViewport).Flags & 0x80) != 0) {
          local_68.Min = (pIVar49->super_ImGuiViewport).Pos;
          local_50 = (pIVar49->super_ImGuiViewport).Size;
        }
      }
      uVar57 = 0;
      AddUpdateViewport((ImGuiWindow *)0x0,0x11111111,&local_68.Min,&local_50,0x200);
      pIVar54->CurrentDpiScale = 0.0;
      pIVar54->CurrentViewport = (ImGuiViewportP *)0x0;
      pIVar54->MouseViewport = (ImGuiViewportP *)0x0;
      iVar59 = (pIVar54->Viewports).Size;
      if (0 < iVar59) {
        do {
          iVar61 = (int)uVar57;
          if (iVar61 < 0) goto LAB_00127e13;
          ppIVar46 = (pIVar54->Viewports).Data;
          pIVar36 = ppIVar46[uVar57];
          *(int *)&(pIVar36->super_ImGuiViewport).field_0x64 = iVar61;
          if ((iVar61 == 0) || (pIVar54->FrameCount + -2 <= pIVar36->LastFrameActive)) {
            bVar27 = pIVar36->PlatformWindowCreated;
            if (((uVar60 >> 10 & 1) != 0) &&
               ((((pIVar36->super_ImGuiViewport).Flags & 0x80) == 0 & bVar27) == 1)) {
              if ((pIVar36->super_ImGuiViewport).PlatformRequestMove == true) {
                IVar67 = (*(pIVar54->PlatformIO).Platform_GetWindowPos)
                                   (&pIVar36->super_ImGuiViewport);
                pIVar36->LastPlatformPos = IVar67;
                (pIVar36->super_ImGuiViewport).Pos = IVar67;
              }
              if ((pIVar36->super_ImGuiViewport).PlatformRequestResize == true) {
                IVar67 = (*(pIVar54->PlatformIO).Platform_GetWindowSize)
                                   (&pIVar36->super_ImGuiViewport);
                pIVar36->LastPlatformSize = IVar67;
                (pIVar36->super_ImGuiViewport).Size = IVar67;
              }
            }
            UpdateViewportPlatformMonitor(pIVar36);
            IVar67 = pIVar36->CurrWorkOffsetMax;
            (pIVar36->super_ImGuiViewport).WorkOffsetMin = pIVar36->CurrWorkOffsetMin;
            (pIVar36->super_ImGuiViewport).WorkOffsetMax = IVar67;
            (pIVar36->CurrWorkOffsetMin).x = 0.0;
            (pIVar36->CurrWorkOffsetMin).y = 0.0;
            (pIVar36->CurrWorkOffsetMax).x = 0.0;
            (pIVar36->CurrWorkOffsetMax).y = 0.0;
            pIVar36->Alpha = 1.0;
            if (((pIVar36->super_ImGuiViewport).Flags & 0x200) != 0) {
              pIVar1 = &(pIVar36->super_ImGuiViewport).Pos;
              IVar67 = *pIVar1;
              IVar68 = pIVar36->LastPos;
              iVar59 = -(uint)(IVar67.x - IVar68.x != 0.0);
              iVar62 = -(uint)(IVar67.y - IVar68.y != 0.0);
              auVar73._4_4_ = iVar62;
              auVar73._0_4_ = iVar59;
              auVar73._8_4_ = iVar62;
              auVar73._12_4_ = iVar62;
              auVar72._8_8_ = auVar73._8_8_;
              auVar72._4_4_ = iVar59;
              auVar72._0_4_ = iVar59;
              iVar59 = movmskpd(extraout_EAX,auVar72);
              if (iVar59 != 0) {
                TranslateWindowsInViewport(pIVar36,&pIVar36->LastPos,pIVar1);
              }
            }
            p_Var19 = (pIVar54->PlatformIO).Platform_GetWindowDpiScale;
            if ((p_Var19 == (_func_float_ImGuiViewport_ptr *)0x0) || (bVar27 == false)) {
              uVar63 = (uint)pIVar36->PlatformMonitor;
              if (uVar63 == 0xffffffff) {
                fVar66 = (pIVar36->super_ImGuiViewport).DpiScale;
                uVar63 = -(uint)(fVar66 != 0.0);
                fVar66 = (float)(~uVar63 & 0x3f800000 | (uint)fVar66 & uVar63);
              }
              else {
                if ((pIVar36->PlatformMonitor < 0) ||
                   ((pIVar54->PlatformIO).Monitors.Size <= (int)uVar63)) {
                  pcVar37 = 
                  "T &ImVector<ImGuiPlatformMonitor>::operator[](int) [T = ImGuiPlatformMonitor]";
                  goto LAB_00127e28;
                }
                fVar66 = (pIVar54->PlatformIO).Monitors.Data[uVar63].DpiScale;
              }
            }
            else {
              fVar66 = (*p_Var19)(&pIVar36->super_ImGuiViewport);
            }
            fVar84 = (pIVar36->super_ImGuiViewport).DpiScale;
            if ((fVar84 != 0.0) || (NAN(fVar84))) {
              if (((fVar66 != fVar84) || (NAN(fVar66) || NAN(fVar84))) &&
                 (((pIVar54->IO).ConfigFlags & 0x4000) != 0)) {
                ScaleWindowsInViewport(pIVar36,fVar66 / fVar84);
              }
            }
            (pIVar36->super_ImGuiViewport).DpiScale = fVar66;
            uVar57 = (ulong)(iVar61 + 1);
          }
          else {
            lVar52 = (long)(pIVar54->Windows).Size;
            if (0 < lVar52) {
              ppIVar16 = (pIVar54->Windows).Data;
              lVar55 = 0;
              do {
                pIVar34 = ppIVar16[lVar55];
                if (pIVar34->Viewport == pIVar36) {
                  pIVar34->Viewport = (ImGuiViewportP *)0x0;
                  if ((pIVar54->Windows).Size <= lVar55) goto LAB_00127ddd;
                  ppIVar16[lVar55]->ViewportOwned = false;
                }
                lVar55 = lVar55 + 1;
              } while (lVar52 != lVar55);
            }
            if (pIVar36 == pIVar54->MouseLastHoveredViewport) {
              pIVar54->MouseLastHoveredViewport = (ImGuiViewportP *)0x0;
            }
            if (iVar59 <= iVar61) {
              __assert_fail("it >= Data && it < Data + Size",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                            ,0x5da,
                            "T *ImVector<ImGuiViewportP *>::erase(const T *) [T = ImGuiViewportP *]"
                           );
            }
            ppIVar46 = ppIVar46 + uVar57;
            memmove(ppIVar46,ppIVar46 + 1,(~uVar57 + (long)iVar59) * 8);
            (pIVar54->Viewports).Size = (pIVar54->Viewports).Size + -1;
            DestroyPlatformWindow(pIVar36);
            ppIVar17 = (pIVar54->PlatformIO).Viewports.Data;
            ppIVar33 = ppIVar17;
            while (ppIVar33 < ppIVar17 + (pIVar54->PlatformIO).Viewports.Size) {
              pIVar18 = (ImGuiViewportP *)*ppIVar33;
              ppIVar33 = ppIVar33 + 1;
              if (pIVar18 == pIVar36) {
                __assert_fail("g.PlatformIO.Viewports.contains(viewport) == false",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                              ,0x2bb0,"void ImGui::UpdateViewportsNewFrame()");
              }
            }
            IM_DELETE<ImGuiViewportP>(pIVar36);
          }
          iVar59 = (pIVar54->Viewports).Size;
        } while ((int)uVar57 < iVar59);
        uVar57 = (ulong)(0 < iVar59);
      }
      if ((uVar60 >> 10 & 1) == 0) {
LAB_00124fe7:
        pIVar54->MouseViewport = pIVar49;
      }
      else {
        if (((pIVar54->IO).BackendFlags & 0x800) == 0) {
          lVar52 = (long)(GImGui->Viewports).Size;
          if (lVar52 < 1) goto LAB_001250bf;
          IVar67 = (pIVar54->IO).MousePos;
          fVar66 = IVar67.x;
          fVar84 = IVar67.y;
          lVar55 = 0;
          pIVar36 = (ImGuiViewportP *)0x0;
          do {
            pIVar49 = (GImGui->Viewports).Data[lVar55];
            if (((((((pIVar49->super_ImGuiViewport).Flags & 0x90) == 0) &&
                  (fVar91 = (pIVar49->super_ImGuiViewport).Pos.x, fVar91 <= fVar66)) &&
                 (fVar94 = (pIVar49->super_ImGuiViewport).Pos.y, fVar94 <= fVar84)) &&
                ((fVar66 < fVar91 + (pIVar49->super_ImGuiViewport).Size.x &&
                 (fVar84 < fVar94 + (pIVar49->super_ImGuiViewport).Size.y)))) &&
               ((pIVar36 == (ImGuiViewportP *)0x0 ||
                (pIVar36->LastFrontMostStampCount < pIVar49->LastFrontMostStampCount)))) {
              pIVar36 = pIVar49;
            }
            lVar55 = lVar55 + 1;
          } while (lVar52 != lVar55);
          if (pIVar36 == (ImGuiViewportP *)0x0) goto LAB_001250bf;
LAB_001250f9:
          pIVar54->MouseLastHoveredViewport = pIVar36;
          bVar27 = false;
          pIVar49 = pIVar36;
        }
        else {
          IVar35 = (pIVar54->IO).MouseHoveredViewport;
          if ((IVar35 != 0) && (lVar52 = (long)(GImGui->Viewports).Size, 0 < lVar52)) {
            lVar55 = 0;
            do {
              pIVar36 = (GImGui->Viewports).Data[lVar55];
              if ((pIVar36->super_ImGuiViewport).ID == IVar35) {
                if (((pIVar36->super_ImGuiViewport).Flags & 0x10) != 0) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                                ,0x2bfd,"void ImGui::UpdateViewportsNewFrame()");
                }
                goto LAB_001250f9;
              }
              lVar55 = lVar55 + 1;
            } while (lVar52 != lVar55);
          }
LAB_001250bf:
          pIVar49 = pIVar54->MouseLastHoveredViewport;
          bVar27 = true;
          if (pIVar49 == (ImGuiViewportP *)0x0) {
            if ((char)uVar57 == '\0') goto LAB_00127e13;
            pIVar49 = *(pIVar54->Viewports).Data;
            pIVar54->MouseLastHoveredViewport = pIVar49;
          }
          pIVar36 = (ImGuiViewportP *)0x0;
        }
        ppIVar46 = &pIVar54->MovingWindow->Viewport;
        if (pIVar54->MovingWindow == (ImGuiWindow *)0x0) {
          ppIVar46 = &pIVar54->MouseLastHoveredViewport;
        }
        if (pIVar54->DragDropActive == false) {
          pIVar49 = pIVar36;
        }
        if (!bVar27) {
          pIVar49 = pIVar36;
        }
        pIVar36 = *ppIVar46;
        pIVar54->MouseViewport = pIVar36;
        if ((pIVar54->DragDropActive == false) && (pIVar54->ActiveId != 0)) {
          if ((GImGui->IO).MouseDown[0] == false) {
            uVar57 = 0;
            do {
              uVar42 = uVar57;
              if (uVar42 == 4) break;
              uVar57 = uVar42 + 1;
            } while ((GImGui->IO).MouseDown[uVar42 + 1] != true);
            if (3 < uVar42) goto LAB_0012517e;
          }
        }
        else {
LAB_0012517e:
          if (((pIVar49 != (ImGuiViewportP *)0x0) && (pIVar49 != pIVar36)) &&
             (((pIVar49->super_ImGuiViewport).Flags & 0x10) == 0)) goto LAB_00124fe7;
        }
        if (pIVar36 == (ImGuiViewportP *)0x0) {
          __assert_fail("g.MouseViewport != __null",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x2c1f,"void ImGui::UpdateViewportsNewFrame()");
        }
      }
      ((ctx_00->IO).Fonts)->Locked = true;
      font = (GImGui->IO).FontDefault;
      if (font == (ImFont *)0x0) {
        pIVar12 = (GImGui->IO).Fonts;
        if ((pIVar12->Fonts).Size < 1) {
          pcVar37 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
          goto LAB_00127e28;
        }
        font = *(pIVar12->Fonts).Data;
      }
      SetCurrentFont(font);
      if (ctx_00->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
        __assert_fail("g.Font->IsLoaded()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0xf77,"void ImGui::NewFrame()");
      }
      lVar52 = (long)(ctx_00->Viewports).Size;
      IVar75 = _DAT_0019ca10;
      if (0 < lVar52) {
        lVar55 = 0;
        auVar22._4_8_ = extraout_XMM0_Qb;
        auVar22._0_4_ = DAT_0019ca10._4_4_;
        IVar75._0_8_ = auVar22._0_8_ << 0x20;
        IVar75.z = DAT_0019ca10._8_4_;
        IVar75.w = DAT_0019ca10._12_4_;
        IVar81 = _DAT_0019ca10;
        do {
          pIVar49 = (ctx_00->Viewports).Data[lVar55];
          IVar67 = (pIVar49->super_ImGuiViewport).Pos;
          IVar68 = (pIVar49->super_ImGuiViewport).Size;
          fVar66 = IVar67.x;
          fVar91 = IVar68.x + fVar66;
          fVar84 = IVar67.y;
          fVar94 = IVar68.y + fVar84;
          uVar60 = -(uint)(fVar66 < IVar81.x);
          uVar63 = -(uint)(fVar84 < IVar81.y);
          uVar64 = -(uint)(IVar75.z < fVar91);
          uVar65 = -(uint)(IVar75.w < fVar94);
          auVar87._0_4_ = (uint)fVar66 & uVar60;
          auVar87._4_4_ = (uint)fVar84 & uVar63;
          auVar87._8_4_ = (uint)fVar91 & uVar64;
          auVar87._12_4_ = (uint)fVar94 & uVar65;
          auVar74._0_4_ = ~uVar60 & (uint)IVar81.x;
          auVar74._4_4_ = ~uVar63 & (uint)IVar81.y;
          auVar74._8_4_ = ~uVar64 & (uint)IVar81.z;
          auVar74._12_4_ = ~uVar65 & (uint)IVar81.w;
          IVar75 = (ImVec4)(auVar74 | auVar87);
          lVar55 = lVar55 + 1;
          IVar81 = IVar75;
        } while (lVar52 != lVar55);
      }
      (ctx_00->DrawListSharedData).ClipRectFullscreen = IVar75;
      fVar66 = (ctx_00->Style).CircleSegmentMaxError;
      (ctx_00->DrawListSharedData).CurveTessellationTol = (ctx_00->Style).CurveTessellationTol;
      ImDrawListSharedData::SetCircleSegmentMaxError(&ctx_00->DrawListSharedData,fVar66);
      bVar27 = (ctx_00->Style).AntiAliasedLines;
      uVar60 = (uint)bVar27;
      (ctx_00->DrawListSharedData).InitialFlags = (uint)bVar27;
      if (((ctx_00->Style).AntiAliasedLinesUseTex != false) &&
         ((ctx_00->Font->ContainerAtlas->Flags & 4) == 0)) {
        uVar60 = bVar27 | 2;
        (ctx_00->DrawListSharedData).InitialFlags = uVar60;
      }
      if ((ctx_00->Style).AntiAliasedFill == true) {
        uVar60 = uVar60 | 4;
        (ctx_00->DrawListSharedData).InitialFlags = uVar60;
      }
      if (((ctx_00->IO).BackendFlags & 8) != 0) {
        (ctx_00->DrawListSharedData).InitialFlags = uVar60 | 8;
      }
      if (0 < (ctx_00->Viewports).Size) {
        lVar52 = 0;
        do {
          pIVar49 = (ctx_00->Viewports).Data[lVar52];
          (pIVar49->super_ImGuiViewport).DrawData = (ImDrawData *)0x0;
          (pIVar49->DrawDataP).Valid = false;
          (pIVar49->DrawDataP).OwnerViewport = (ImGuiViewport *)0x0;
          (pIVar49->DrawDataP).CmdLists = (ImDrawList **)0x0;
          (pIVar49->DrawDataP).CmdListsCount = 0;
          (pIVar49->DrawDataP).TotalIdxCount = 0;
          (pIVar49->DrawDataP).TotalVtxCount = 0;
          (pIVar49->DrawDataP).DisplayPos.x = 0.0;
          *(undefined8 *)&(pIVar49->DrawDataP).DisplayPos.y = 0;
          (pIVar49->DrawDataP).DisplaySize.x = 0.0;
          (pIVar49->DrawDataP).DisplaySize.y = 0.0;
          (pIVar49->DrawDataP).FramebufferScale.x = 0.0;
          (pIVar49->DrawDataP).FramebufferScale.y = 0.0;
          lVar52 = lVar52 + 1;
        } while (lVar52 < (ctx_00->Viewports).Size);
      }
      pIVar54 = GImGui;
      if ((ctx_00->DragDropActive != false) &&
         (IVar35 = (ctx_00->DragDropPayload).SourceId, IVar35 == ctx_00->ActiveId)) {
        if (GImGui->ActiveId == IVar35) {
          GImGui->ActiveIdIsAlive = IVar35;
        }
        if (pIVar54->ActiveIdPreviousFrame == IVar35) {
          pIVar54->ActiveIdPreviousFrameIsAlive = true;
        }
      }
      if (ctx_00->HoveredIdPreviousFrame == 0) {
        IVar35 = ctx_00->HoveredId;
        ctx_00->HoveredIdTimer = 0.0;
        ctx_00->HoveredIdNotActiveTimer = 0.0;
        if (IVar35 == 0) goto LAB_001253b2;
LAB_0012538b:
        fVar66 = (ctx_00->IO).DeltaTime;
        ctx_00->HoveredIdTimer = ctx_00->HoveredIdTimer + fVar66;
        IVar31 = IVar35;
        if (ctx_00->ActiveId != IVar35) {
          ctx_00->HoveredIdNotActiveTimer = fVar66 + ctx_00->HoveredIdNotActiveTimer;
          IVar31 = ctx_00->ActiveId;
        }
      }
      else {
        IVar35 = ctx_00->HoveredId;
        if (IVar35 != 0) {
          if (ctx_00->ActiveId == IVar35) {
            ctx_00->HoveredIdNotActiveTimer = 0.0;
          }
          goto LAB_0012538b;
        }
LAB_001253b2:
        IVar35 = 0;
        IVar31 = ctx_00->ActiveId;
      }
      ctx_00->HoveredIdPreviousFrame = IVar35;
      ctx_00->HoveredId = 0;
      ctx_00->HoveredIdAllowOverlap = false;
      ctx_00->HoveredIdDisabled = false;
      if (((ctx_00->ActiveIdIsAlive != IVar31) && (IVar31 != 0)) &&
         (ctx_00->ActiveIdPreviousFrame == IVar31)) {
        SetActiveID(0,(ImGuiWindow *)0x0);
        IVar31 = ctx_00->ActiveId;
      }
      fVar66 = (ctx_00->IO).DeltaTime;
      if (IVar31 != 0) {
        ctx_00->ActiveIdTimer = ctx_00->ActiveIdTimer + fVar66;
      }
      ctx_00->LastActiveIdTimer = ctx_00->LastActiveIdTimer + fVar66;
      ctx_00->ActiveIdPreviousFrame = IVar31;
      ctx_00->ActiveIdPreviousFrameWindow = ctx_00->ActiveIdWindow;
      ctx_00->ActiveIdPreviousFrameHasBeenEditedBefore = ctx_00->ActiveIdHasBeenEditedBefore;
      ctx_00->ActiveIdIsAlive = 0;
      ctx_00->ActiveIdHasBeenEditedThisFrame = false;
      ctx_00->ActiveIdPreviousFrameIsAlive = false;
      ctx_00->ActiveIdIsJustActivated = false;
      if (ctx_00->TempInputId == 0) {
LAB_0012548f:
        if (IVar31 == 0) {
          ctx_00->ActiveIdUsingNavDirMask = 0;
          ctx_00->ActiveIdUsingNavInputMask = 0;
          ctx_00->ActiveIdUsingKeyInputMask = 0;
        }
      }
      else if (IVar31 != ctx_00->TempInputId) {
        ctx_00->TempInputId = 0;
        goto LAB_0012548f;
      }
      ctx_00->DragDropAcceptIdPrev = ctx_00->DragDropAcceptIdCurr;
      ctx_00->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
      ctx_00->DragDropAcceptIdCurr = 0;
      ctx_00->DragDropWithinSource = false;
      ctx_00->DragDropWithinTarget = false;
      ctx_00->DragDropHoldJustPressedId = 0;
      pIVar54 = GImGui;
      bVar27 = (GImGui->IO).KeyCtrl;
      uVar60 = bVar27 + 2;
      if ((GImGui->IO).KeyShift == false) {
        uVar60 = (uint)bVar27;
      }
      uVar63 = uVar60 + 4;
      if ((GImGui->IO).KeyAlt == false) {
        uVar63 = uVar60;
      }
      uVar60 = uVar63 + 8;
      if ((GImGui->IO).KeySuper == false) {
        uVar60 = uVar63;
      }
      (ctx_00->IO).KeyMods = uVar60;
      memcpy((ctx_00->IO).KeysDownDurationPrev,(ctx_00->IO).KeysDownDuration,0x800);
      lVar52 = 0x140;
      do {
        fVar84 = -1.0;
        if (*(char *)((long)(ctx_00->IO).KeyMap + lVar52 + -0x3c) == '\x01') {
          fVar91 = *(float *)((long)ctx_00 + lVar52 * 4 + -0x68);
          fVar84 = 0.0;
          if (0.0 <= fVar91) {
            fVar84 = fVar91 + fVar66;
          }
        }
        *(float *)((long)ctx_00 + lVar52 * 4 + -0x68) = fVar84;
        lVar52 = lVar52 + 1;
      } while (lVar52 != 0x340);
      (pIVar54->IO).WantSetMousePos = false;
      pIVar54->NavWrapRequestWindow = (ImGuiWindow *)0x0;
      pIVar54->NavWrapRequestFlags = 0;
      uVar60 = (pIVar54->IO).ConfigFlags;
      if (((uVar60 & 2) == 0) || (((pIVar54->IO).BackendFlags & 1) == 0)) {
        bVar24 = 0;
      }
      else {
        bVar24 = 1;
        if ((pIVar54->NavInputSource != ImGuiInputSource_NavGamepad) &&
           (((bVar24 = 1, 0.0 < (pIVar54->IO).NavInputs[0] || (0.0 < (pIVar54->IO).NavInputs[2])) ||
            ((0.0 < (pIVar54->IO).NavInputs[1] ||
             ((((0.0 < (pIVar54->IO).NavInputs[3] || (0.0 < (pIVar54->IO).NavInputs[4])) ||
               (0.0 < (pIVar54->IO).NavInputs[5])) ||
              ((0.0 < (pIVar54->IO).NavInputs[6] || (0.0 < (pIVar54->IO).NavInputs[7])))))))))) {
          pIVar54->NavInputSource = ImGuiInputSource_NavGamepad;
        }
      }
      if ((uVar60 & 1) != 0) {
        uVar63 = (pIVar54->IO).KeyMap[0xc];
        if (-1 < (long)(int)uVar63) {
          if (0x1ff < uVar63) goto LAB_00127ec8;
          if ((pIVar54->IO).KeysDown[(int)uVar63] == true) {
            (pIVar54->IO).NavInputs[0] = 1.0;
            pIVar54->NavInputSource = ImGuiInputSource_NavKeyboard;
          }
        }
        uVar63 = (pIVar54->IO).KeyMap[0xd];
        if (-1 < (long)(int)uVar63) {
          if (0x1ff < uVar63) goto LAB_00127ec8;
          if ((pIVar54->IO).KeysDown[(int)uVar63] == true) {
            (pIVar54->IO).NavInputs[2] = 1.0;
            pIVar54->NavInputSource = ImGuiInputSource_NavKeyboard;
          }
        }
        uVar63 = (pIVar54->IO).KeyMap[0xe];
        if (-1 < (long)(int)uVar63) {
          if (0x1ff < uVar63) goto LAB_00127ec8;
          if ((pIVar54->IO).KeysDown[(int)uVar63] == true) {
            (pIVar54->IO).NavInputs[1] = 1.0;
            pIVar54->NavInputSource = ImGuiInputSource_NavKeyboard;
          }
        }
        uVar63 = (pIVar54->IO).KeyMap[1];
        if (-1 < (long)(int)uVar63) {
          if (0x1ff < uVar63) goto LAB_00127ec8;
          if ((pIVar54->IO).KeysDown[(int)uVar63] == true) {
            (pIVar54->IO).NavInputs[0x11] = 1.0;
            pIVar54->NavInputSource = ImGuiInputSource_NavKeyboard;
          }
        }
        uVar63 = (pIVar54->IO).KeyMap[2];
        if (-1 < (long)(int)uVar63) {
          if (0x1ff < uVar63) goto LAB_00127ec8;
          if ((pIVar54->IO).KeysDown[(int)uVar63] == true) {
            (pIVar54->IO).NavInputs[0x12] = 1.0;
            pIVar54->NavInputSource = ImGuiInputSource_NavKeyboard;
          }
        }
        uVar63 = (pIVar54->IO).KeyMap[3];
        if (-1 < (long)(int)uVar63) {
          if (0x1ff < uVar63) goto LAB_00127ec8;
          if ((pIVar54->IO).KeysDown[(int)uVar63] == true) {
            (pIVar54->IO).NavInputs[0x13] = 1.0;
            pIVar54->NavInputSource = ImGuiInputSource_NavKeyboard;
          }
        }
        uVar63 = (pIVar54->IO).KeyMap[4];
        if (-1 < (long)(int)uVar63) {
          if (0x1ff < uVar63) {
LAB_00127ec8:
            __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown))))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                          ,0x12a0,"bool ImGui::IsKeyDown(int)");
          }
          if ((pIVar54->IO).KeysDown[(int)uVar63] == true) {
            (pIVar54->IO).NavInputs[0x14] = 1.0;
            pIVar54->NavInputSource = ImGuiInputSource_NavKeyboard;
          }
        }
        bVar27 = (pIVar54->IO).KeyCtrl;
        if (bVar27 == true) {
          (pIVar54->IO).NavInputs[0xe] = 1.0;
        }
        if ((pIVar54->IO).KeyShift == true) {
          (pIVar54->IO).NavInputs[0xf] = 1.0;
        }
        if ((bVar27 == false) && ((pIVar54->IO).KeyAlt != false)) {
          (pIVar54->IO).NavInputs[0x10] = 1.0;
        }
      }
      pfVar5 = (pIVar54->IO).NavInputsDownDuration;
      pfVar43 = pfVar5;
      pfVar47 = (pIVar54->IO).NavInputsDownDurationPrev;
      for (lVar52 = 0x15; lVar52 != 0; lVar52 = lVar52 + -1) {
        *pfVar47 = *pfVar43;
        pfVar43 = pfVar43 + (ulong)bVar58 * -2 + 1;
        pfVar47 = pfVar47 + (ulong)bVar58 * -2 + 1;
      }
      lVar52 = 0;
      do {
        fVar66 = -1.0;
        if (0.0 < (pIVar54->IO).NavInputs[lVar52]) {
          fVar66 = 0.0;
          if (0.0 <= pfVar5[lVar52]) {
            fVar66 = pfVar5[lVar52] + (pIVar54->IO).DeltaTime;
          }
        }
        pfVar5[lVar52] = fVar66;
        lVar52 = lVar52 + 1;
      } while (lVar52 != 0x15);
      IVar35 = pIVar54->NavInitResultId;
      if ((IVar35 != 0) &&
         (((pIVar54->NavDisableHighlight != true || (pIVar54->NavInitRequestFromMove == true)) &&
          (pIVar54->NavWindow != (ImGuiWindow *)0x0)))) {
        IVar44 = pIVar54->NavLayer;
        if (pIVar54->NavInitRequestFromMove == true) {
          SetNavID(IVar35,IVar44,0);
          IVar67 = (pIVar54->NavInitResultRectRel).Max;
          pIVar1 = &pIVar54->NavWindow->NavRectRel[(int)IVar44].Min;
          *pIVar1 = (pIVar54->NavInitResultRectRel).Min;
          pIVar1[1] = IVar67;
          pIVar54->NavMousePosDirty = true;
          pIVar54->NavDisableHighlight = false;
          pIVar54->NavDisableMouseHover = true;
        }
        else {
          SetNavID(IVar35,IVar44,0);
        }
        IVar67 = (pIVar54->NavInitResultRectRel).Max;
        pIVar1 = &pIVar54->NavWindow->NavRectRel[pIVar54->NavLayer].Min;
        *pIVar1 = (pIVar54->NavInitResultRectRel).Min;
        pIVar1[1] = IVar67;
      }
      pIVar54->NavInitRequest = false;
      pIVar54->NavInitRequestFromMove = false;
      pIVar54->NavInitResultId = 0;
      pIVar54->NavJustMovedToId = 0;
      pIVar25 = GImGui;
      if (pIVar54->NavMoveRequest == true) {
        IVar35 = (GImGui->NavMoveResultLocal).ID;
        if ((IVar35 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
          pIVar56 = GImGui;
          if (GImGui->NavId == 0) goto LAB_00125b5c;
        }
        else {
          pIVar2 = &GImGui->NavMoveResultOther;
          pIVar51 = &GImGui->NavMoveResultLocal;
          if (IVar35 == 0) {
            pIVar51 = pIVar2;
          }
          if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
              (IVar35 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar35 != 0)) &&
             (IVar35 != GImGui->NavId)) {
            pIVar51 = &GImGui->NavMoveResultLocalVisibleSet;
          }
          if (pIVar51 == pIVar2) {
LAB_00125a25:
            pIVar51 = pIVar2;
          }
          else if (((GImGui->NavMoveResultOther).ID != 0) &&
                  (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
            fVar66 = (GImGui->NavMoveResultOther).DistBox;
            fVar84 = pIVar51->DistBox;
            if (fVar84 <= fVar66) {
              if (((fVar66 != fVar84) || (NAN(fVar66) || NAN(fVar84))) ||
                 (pfVar5 = &(GImGui->NavMoveResultOther).DistCenter,
                 pIVar51->DistCenter < *pfVar5 || pIVar51->DistCenter == *pfVar5))
              goto LAB_00125a28;
            }
            goto LAB_00125a25;
          }
LAB_00125a28:
          if ((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
             (pIVar34 = pIVar51->Window, pIVar34 == (ImGuiWindow *)0x0)) {
            __assert_fail("g.NavWindow && result->Window",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                          ,0x25d1,"void ImGui::NavUpdateMoveResult()");
          }
          if (GImGui->NavLayer == ImGuiNavLayer_Main) {
            if ((GImGui->NavMoveRequestFlags & 0x40U) == 0) {
              IVar67 = (pIVar51->RectRel).Min;
              IVar68 = (pIVar51->RectRel).Max;
              fVar66 = (pIVar34->Pos).x;
              local_68.Min.x = IVar67.x + fVar66;
              fVar84 = (pIVar34->Pos).y;
              local_68.Min.y = IVar67.y + fVar84;
              local_68.Max.x = IVar68.x + fVar66;
              local_68.Max.y = IVar68.y + fVar84;
              IVar67 = ScrollToBringRectIntoView(pIVar51->Window,&local_68);
            }
            else {
              fVar66 = 0.0;
              if (GImGui->NavMoveDir == 2) {
                fVar66 = (pIVar34->ScrollMax).y;
              }
              IVar67 = (ImVec2)((ulong)(uint)((pIVar34->Scroll).y - fVar66) << 0x20);
              (pIVar34->ScrollTarget).y = fVar66;
              (pIVar34->ScrollTargetCenterRatio).y = 0.0;
              (pIVar34->ScrollTargetEdgeSnapDist).y = 0.0;
            }
            fVar66 = (pIVar51->RectRel).Min.y;
            fVar84 = (pIVar51->RectRel).Max.x;
            fVar91 = (pIVar51->RectRel).Max.y;
            (pIVar51->RectRel).Min.x = (pIVar51->RectRel).Min.x - IVar67.x;
            (pIVar51->RectRel).Min.y = fVar66 - IVar67.y;
            (pIVar51->RectRel).Max.x = fVar84 - IVar67.x;
            (pIVar51->RectRel).Max.y = fVar91 - IVar67.y;
          }
          SetActiveID(0,(ImGuiWindow *)0x0);
          pIVar25->NavWindow = pIVar51->Window;
          IVar35 = pIVar51->ID;
          if (pIVar25->NavId == IVar35) {
            IVar31 = pIVar51->FocusScopeId;
          }
          else {
            pIVar25->NavJustMovedToId = IVar35;
            IVar31 = pIVar51->FocusScopeId;
            pIVar25->NavJustMovedToFocusScopeId = IVar31;
            pIVar25->NavJustMovedToKeyMods = pIVar25->NavMoveRequestKeyMods;
          }
          pIVar56 = GImGui;
          IVar44 = pIVar25->NavLayer;
          SetNavID(IVar35,IVar44,IVar31);
          IVar67 = (pIVar51->RectRel).Max;
          pIVar1 = &pIVar56->NavWindow->NavRectRel[(int)IVar44].Min;
          *pIVar1 = (pIVar51->RectRel).Min;
          pIVar1[1] = IVar67;
          pIVar56->NavMousePosDirty = true;
        }
        pIVar56->NavDisableHighlight = false;
        pIVar56->NavDisableMouseHover = true;
      }
LAB_00125b5c:
      if (pIVar54->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
        if (pIVar54->NavMoveRequest == false) {
          __assert_fail("g.NavMoveRequest",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x24cd,"void ImGui::NavUpdate()");
        }
        if (((pIVar54->NavMoveResultLocal).ID == 0) && ((pIVar54->NavMoveResultOther).ID == 0)) {
          pIVar54->NavDisableHighlight = false;
        }
        pIVar54->NavMoveRequestForward = ImGuiNavForward_None;
      }
      if ((pIVar54->NavMousePosDirty == true) && (pIVar54->NavIdIsAlive == true)) {
        if ((((pIVar54->IO).ConfigFlags & 4) != 0) &&
           ((((((pIVar54->IO).BackendFlags & 4) != 0 && (pIVar54->NavDisableHighlight == false)) &&
             (pIVar54->NavDisableMouseHover == true)) && (pIVar54->NavWindow != (ImGuiWindow *)0x0))
           )) {
          IVar67 = NavCalcPreferredRefPos();
          (pIVar54->IO).MousePosPrev = IVar67;
          (pIVar54->IO).MousePos = IVar67;
          (pIVar54->IO).WantSetMousePos = true;
        }
        pIVar54->NavMousePosDirty = false;
      }
      pIVar54->NavIdIsAlive = false;
      pIVar54->NavJustTabbedId = 0;
      IVar44 = pIVar54->NavLayer;
      if (ImGuiNavLayer_Menu < IVar44) {
        __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x24e3,"void ImGui::NavUpdate()");
      }
      pIVar34 = pIVar54->NavWindow;
      pIVar38 = pIVar34;
      if (pIVar34 != (ImGuiWindow *)0x0) {
        do {
          if ((pIVar38->RootWindowDockStop == pIVar38) ||
             ((pIVar38->Flags & 0x15000000U) != 0x1000000)) {
            if (pIVar38 != pIVar34) {
              pIVar38->NavLastChildNavWindow = pIVar34;
            }
            break;
          }
          ppIVar16 = &pIVar38->ParentWindow;
          pIVar38 = *ppIVar16;
        } while (*ppIVar16 != (ImGuiWindow *)0x0);
        if ((IVar44 == ImGuiNavLayer_Main) && (pIVar34->NavLastChildNavWindow != (ImGuiWindow *)0x0)
           ) {
          pIVar34->NavLastChildNavWindow = (ImGuiWindow *)0x0;
        }
      }
      pIVar25 = GImGui;
      pIVar34 = GetTopMostPopupModal();
      if (pIVar34 != (ImGuiWindow *)0x0) {
        pIVar25->NavWindowingTarget = (ImGuiWindow *)0x0;
      }
      if ((pIVar25->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
         (pIVar25->NavWindowingTarget == (ImGuiWindow *)0x0)) {
        fVar66 = (pIVar25->IO).DeltaTime * -10.0 + pIVar25->NavWindowingHighlightAlpha;
        fVar66 = (float)(-(uint)(0.0 <= fVar66) & (uint)fVar66);
        pIVar25->NavWindowingHighlightAlpha = fVar66;
        if ((pIVar25->DimBgRatio <= 0.0) && (fVar66 <= 0.0)) {
          pIVar25->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
        }
      }
      if ((pIVar34 == (ImGuiWindow *)0x0) && (pIVar25->NavWindowingTarget == (ImGuiWindow *)0x0)) {
        fVar66 = (pIVar25->IO).NavInputsDownDuration[3];
        if (((pIVar25->IO).KeyCtrl == true) &&
           ((iVar59 = (pIVar25->IO).KeyMap[0], -1 < iVar59 &&
            (local_48 = fVar66, bVar27 = IsKeyPressed(iVar59,true), fVar66 = local_48, bVar27)))) {
          bVar58 = (byte)(pIVar25->IO).ConfigFlags;
          uVar63 = (uint)bVar58;
          if (local_48 == 0.0 || (bVar58 & 1) != 0) {
LAB_00125d81:
            pIVar34 = pIVar25->NavWindow;
            if ((pIVar34 != (ImGuiWindow *)0x0) ||
               (pIVar34 = FindWindowNavFocusable
                                    ((pIVar25->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
               pIVar34 != (ImGuiWindow *)0x0)) {
              pIVar34 = pIVar34->RootWindowDockStop;
              pIVar25->NavWindowingTargetAnim = pIVar34;
              pIVar25->NavWindowingTarget = pIVar34;
              pIVar25->NavWindowingTimer = 0.0;
              pIVar25->NavWindowingHighlightAlpha = 0.0;
              pIVar25->NavWindowingToggleLayer = (bool)(~(byte)uVar63 & 1);
              pIVar25->NavInputSource = ImGuiInputSource_NavGamepad - (uVar63 & 1);
            }
          }
        }
        else if ((fVar66 == 0.0) && (!NAN(fVar66))) {
          uVar63 = 0;
          goto LAB_00125d81;
        }
      }
      fVar66 = (pIVar25->IO).DeltaTime + pIVar25->NavWindowingTimer;
      pIVar25->NavWindowingTimer = fVar66;
      if (pIVar25->NavWindowingTarget == (ImGuiWindow *)0x0) {
LAB_00125f9d:
        bVar27 = false;
        pIVar34 = (ImGuiWindow *)0x0;
      }
      else {
        IVar32 = pIVar25->NavInputSource;
        if (IVar32 != ImGuiInputSource_NavGamepad) {
LAB_00125f02:
          if (IVar32 == ImGuiInputSource_NavKeyboard) {
            fVar84 = (pIVar25->NavWindowingTimer + -0.2) / 0.05;
            fVar66 = 1.0;
            if (fVar84 <= 1.0) {
              fVar66 = fVar84;
            }
            fVar66 = (float)(~-(uint)(fVar84 < 0.0) & (uint)fVar66);
            uVar63 = -(uint)(fVar66 <= pIVar25->NavWindowingHighlightAlpha);
            pIVar25->NavWindowingHighlightAlpha =
                 (float)(uVar63 & (uint)pIVar25->NavWindowingHighlightAlpha | ~uVar63 & (uint)fVar66
                        );
            iVar59 = (GImGui->IO).KeyMap[0];
            if ((-1 < iVar59) && (bVar27 = IsKeyPressed(iVar59,true), bVar27)) {
              NavUpdateWindowingHighlightWindow((pIVar25->IO).KeyShift - 1 | 1);
            }
            if ((pIVar25->IO).KeyCtrl == false) {
              pIVar34 = pIVar25->NavWindowingTarget;
              bVar27 = false;
              goto LAB_00125fa2;
            }
          }
          goto LAB_00125f9d;
        }
        fVar84 = (fVar66 + -0.2) / 0.05;
        fVar66 = 1.0;
        if (fVar84 <= 1.0) {
          fVar66 = fVar84;
        }
        fVar66 = (float)(~-(uint)(fVar84 < 0.0) & (uint)fVar66);
        uVar63 = -(uint)(fVar66 <= pIVar25->NavWindowingHighlightAlpha);
        local_48 = (float)(uVar63 & (uint)pIVar25->NavWindowingHighlightAlpha |
                          ~uVar63 & (uint)fVar66);
        uStack_44 = 0;
        uStack_40 = 0;
        uStack_3c = 0;
        pIVar25->NavWindowingHighlightAlpha = local_48;
        fVar66 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
        fVar84 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
        iVar59 = (uint)(0.0 < fVar66) - (uint)(0.0 < fVar84);
        fVar66 = local_48;
        if (iVar59 != 0) {
          NavUpdateWindowingHighlightWindow(iVar59);
          pIVar25->NavWindowingHighlightAlpha = 1.0;
          fVar66 = 1.0;
        }
        if (0.0 < (GImGui->IO).NavInputs[3]) {
          if (pIVar25->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_00125f9d;
          IVar32 = pIVar25->NavInputSource;
          goto LAB_00125f02;
        }
        pbVar53 = &pIVar25->NavWindowingToggleLayer;
        *pbVar53 = (bool)(*pbVar53 & fVar66 < 1.0);
        if (*pbVar53 == false) {
          pIVar34 = pIVar25->NavWindowingTarget;
          bVar27 = false;
        }
        else {
          bVar27 = pIVar25->NavWindow != (ImGuiWindow *)0x0;
          pIVar34 = (ImGuiWindow *)0x0;
        }
        pIVar25->NavWindowingTarget = (ImGuiWindow *)0x0;
      }
LAB_00125fa2:
      pIVar56 = GImGui;
      fVar66 = (GImGui->IO).NavInputsDownDuration[0x10];
      if ((fVar66 == 0.0) && (!NAN(fVar66))) {
        pIVar25->NavWindowingToggleLayer = true;
      }
      if ((((pIVar25->ActiveId == 0) || (pIVar25->ActiveIdAllowOverlap == true)) && (fVar66 < 0.0))
         && ((pIVar25->NavWindowingToggleLayer != false &&
             (0.0 <= (pIVar56->IO).NavInputsDownDurationPrev[0x10])))) {
        bVar28 = IsMousePosValid(&(pIVar25->IO).MousePos);
        bVar29 = IsMousePosValid(&(pIVar25->IO).MousePosPrev);
        bVar27 = (bool)(bVar29 == bVar28 | bVar27);
      }
      pIVar38 = pIVar25->NavWindowingTarget;
      if ((pIVar38 != (ImGuiWindow *)0x0) && ((pIVar38->Flags & 4) == 0)) {
        IVar32 = pIVar25->NavInputSource;
        if ((IVar32 == ImGuiInputSource_NavGamepad) ||
           ((IVar67.x = 0.0, IVar67.y = 0.0, IVar32 == ImGuiInputSource_NavKeyboard &&
            (IVar32 = ImGuiInputSource_Mouse, (pIVar25->IO).KeyShift == false)))) {
          IVar67 = GetNavInputAmount2d(IVar32,ImGuiInputReadMode_Down,0.0,0.0);
        }
        fVar66 = IVar67.y;
        if (((IVar67.x != 0.0) || (fVar66 != 0.0)) || (NAN(fVar66))) {
          fVar84 = (pIVar25->IO).DisplayFramebufferScale.x;
          fVar91 = (pIVar25->IO).DisplayFramebufferScale.y;
          if (fVar91 <= fVar84) {
            fVar84 = fVar91;
          }
          fVar84 = (float)(int)(fVar84 * (pIVar25->IO).DeltaTime * 800.0);
          pIVar38 = pIVar38->RootWindow;
          local_68.Min.x = (pIVar38->Pos).x + IVar67.x * fVar84;
          local_68.Min.y = (pIVar38->Pos).y + fVar66 * fVar84;
          SetWindowPos(pIVar38,&local_68.Min,1);
          if (((pIVar38->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
            GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
          }
          pIVar25->NavDisableMouseHover = true;
        }
      }
      if (pIVar34 != (ImGuiWindow *)0x0) {
        pIVar38 = pIVar25->NavWindow;
        if (pIVar38 == (ImGuiWindow *)0x0) {
          pIVar49 = (ImGuiViewportP *)0x0;
LAB_0012612d:
          SetActiveID(0,(ImGuiWindow *)0x0);
          pIVar25->NavDisableHighlight = false;
          pIVar25->NavDisableMouseHover = true;
          pIVar34 = NavRestoreLastChildNavWindow(pIVar34);
          ClosePopupsOverWindow(pIVar34,false);
          FocusWindow(pIVar34);
          if (pIVar34->NavLastIds[0] == 0) {
            NavInitWindow(pIVar34,false);
          }
          if ((pIVar34->DC).NavLayerActiveMask == 2) {
            pIVar25->NavLayer = ImGuiNavLayer_Menu;
          }
          if ((pIVar34->Viewport != pIVar49) &&
             (p_Var20 = (pIVar25->PlatformIO).Platform_SetWindowFocus,
             p_Var20 != (_func_void_ImGuiViewport_ptr *)0x0)) {
            (*p_Var20)(&pIVar34->Viewport->super_ImGuiViewport);
          }
        }
        else if (pIVar34 != pIVar38->RootWindowDockStop) {
          pIVar49 = pIVar38->Viewport;
          goto LAB_0012612d;
        }
        pIVar25->NavWindowingTarget = (ImGuiWindow *)0x0;
      }
      if ((bVar27) &&
         (pIVar34 = pIVar25->NavWindow, pIVar38 = pIVar34, pIVar34 != (ImGuiWindow *)0x0)) {
        while (window_00 = pIVar38, window_00->ParentWindow != (ImGuiWindow *)0x0) {
          if ((((window_00->DC).NavLayerActiveMask & 2) != 0) ||
             (pIVar38 = window_00->ParentWindow, (window_00->Flags & 0x15000000U) != 0x1000000))
          break;
        }
        if (window_00 != pIVar34) {
          FocusWindow(window_00);
          window_00->NavLastChildNavWindow = pIVar34;
          pIVar34 = pIVar25->NavWindow;
        }
        pIVar25->NavDisableHighlight = false;
        pIVar25->NavDisableMouseHover = true;
        IVar44 = ImGuiNavLayer_Main;
        if (((pIVar34->DC).NavLayerActiveMask & 2) != 0) {
          if (pIVar25->NavLayer == ImGuiNavLayer_Main) {
            IVar44 = ImGuiNavLayer_Menu;
            if (window_00->DockNodeAsHost == (ImGuiDockNode *)0x0) {
              pIVar34->NavLastIds[1] = 0;
            }
          }
          else {
            IVar44 = pIVar25->NavLayer ^ ImGuiNavLayer_Menu;
          }
        }
        NavRestoreLayer(IVar44);
      }
      if (((bool)((uVar60 & 1) == 0 & (bVar24 ^ 1))) || (pIVar54->NavWindow == (ImGuiWindow *)0x0))
      {
        (pIVar54->IO).NavActive = false;
LAB_0012630f:
        bVar27 = pIVar54->NavWindowingTarget != (ImGuiWindow *)0x0;
      }
      else {
        bVar27 = (pIVar54->NavWindow->Flags & 0x40000U) == 0;
        (pIVar54->IO).NavActive = bVar27;
        if (((!bVar27) || (pIVar54->NavId == 0)) ||
           (bVar27 = true, pIVar54->NavDisableHighlight != false)) goto LAB_0012630f;
      }
      (pIVar54->IO).NavVisible = bVar27;
      fVar66 = (GImGui->IO).NavInputsDownDuration[1];
      if ((fVar66 == 0.0) && (!NAN(fVar66))) {
        if (pIVar54->ActiveId == 0) {
          pIVar34 = pIVar54->NavWindow;
          if (((pIVar34 == (ImGuiWindow *)0x0) || ((pIVar34->Flags & 0x5000000U) != 0x1000000)) ||
             ((pIVar34->ParentWindow == (ImGuiWindow *)0x0 ||
              (pIVar34 == pIVar34->RootWindowDockStop)))) {
            iVar59 = (pIVar54->OpenPopupStack).Size;
            if ((long)iVar59 < 1) {
              if (pIVar54->NavLayer == ImGuiNavLayer_Main) {
                if ((pIVar34 != (ImGuiWindow *)0x0) && ((pIVar34->Flags & 0x5000000U) != 0x1000000))
                {
                  pIVar34->NavLastIds[0] = 0;
                }
                pIVar54->NavId = 0;
                pIVar54->NavFocusScopeId = 0;
              }
              else {
                NavRestoreLayer(ImGuiNavLayer_Main);
              }
            }
            else if ((((pIVar54->OpenPopupStack).Data[(long)iVar59 + -1].Window)->Flags & 0x8000000)
                     == 0) {
              ClosePopupToLevel(iVar59 + -1,true);
            }
          }
          else {
            if (pIVar34->ChildId == 0) {
              __assert_fail("child_window->ChildId != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                            ,0x2500,"void ImGui::NavUpdate()");
            }
            FocusWindow(pIVar34->ParentWindow);
            pIVar25 = GImGui;
            pIVar38 = GImGui->NavWindow;
            if (pIVar38 == (ImGuiWindow *)0x0) {
              __assert_fail("g.NavWindow",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                            ,0x22d9,"void ImGui::SetNavID(ImGuiID, int, ImGuiID)");
            }
            IVar35 = pIVar34->ChildId;
            GImGui->NavId = IVar35;
            pIVar25->NavFocusScopeId = 0;
            pIVar38->NavLastIds[0] = IVar35;
            pIVar54->NavIdIsAlive = false;
            if (pIVar54->NavDisableMouseHover == true) {
              pIVar54->NavMousePosDirty = true;
            }
          }
        }
        else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
          SetActiveID(0,(ImGuiWindow *)0x0);
        }
      }
      pIVar54->NavActivateId = 0;
      pIVar54->NavActivateDownId = 0;
      pIVar54->NavActivatePressedId = 0;
      pIVar25 = GImGui;
      pIVar54->NavInputId = 0;
      IVar35 = pIVar54->NavId;
      IVar31 = 0;
      if ((IVar35 == 0) || (pIVar54->NavDisableHighlight != false)) {
        IVar41 = 0;
LAB_001264bd:
        pIVar34 = pIVar54->NavWindow;
        bVar27 = pIVar34 == (ImGuiWindow *)0x0;
        if ((!bVar27) && ((pIVar34->Flags & 0x40000) != 0)) {
          pIVar54->NavDisableHighlight = true;
        }
        if (IVar31 != IVar41 && IVar41 != 0) {
          __assert_fail("g.NavActivateDownId == g.NavActivateId",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x252e,"void ImGui::NavUpdate()");
        }
      }
      else {
        IVar41 = 0;
        if (pIVar54->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_001264bd;
        IVar31 = 0;
        if (pIVar54->NavWindow != (ImGuiWindow *)0x0) {
          if ((pIVar54->NavWindow->Flags & 0x40000) == 0) {
            if (0.0 < (GImGui->IO).NavInputs[0]) {
              fVar66 = (GImGui->IO).NavInputsDownDuration[0];
              IVar26 = IVar35;
              if (0.0 <= fVar66) {
                IVar45 = pIVar54->ActiveId;
                if (IVar45 == 0 && fVar66 == 0.0) {
                  pIVar54->NavActivateId = IVar35;
                  pIVar54->NavActivateDownId = IVar35;
                  IVar41 = IVar35;
                }
                else {
                  if (IVar45 == 0) {
                    pIVar54->NavActivateDownId = IVar35;
                  }
                  else {
                    if (IVar45 != IVar35) goto LAB_0012695a;
                    pIVar54->NavActivateDownId = IVar35;
                  }
                  IVar41 = 0;
                  if ((fVar66 != 0.0) || (IVar41 = 0, NAN(fVar66))) goto LAB_00127ac3;
                }
                pIVar54->NavActivatePressedId = IVar35;
              }
              else {
                IVar45 = pIVar54->ActiveId;
                if ((IVar45 != 0) && (IVar45 != IVar35)) goto LAB_0012695a;
                pIVar54->NavActivateDownId = IVar35;
                IVar41 = 0;
              }
            }
            else {
              IVar45 = pIVar54->ActiveId;
              if (IVar45 == 0) {
                IVar41 = 0;
                IVar26 = 0;
              }
              else {
LAB_0012695a:
                IVar31 = 0;
                IVar41 = 0;
                IVar26 = 0;
                if (IVar45 != IVar35) goto LAB_001264bd;
              }
            }
LAB_00127ac3:
            IVar31 = IVar26;
            fVar66 = (pIVar25->IO).NavInputsDownDuration[2];
            if ((fVar66 == 0.0) && (!NAN(fVar66))) {
              pIVar54->NavInputId = IVar35;
            }
          }
          goto LAB_001264bd;
        }
        bVar27 = true;
        pIVar34 = (ImGuiWindow *)0x0;
      }
      pIVar54->NavMoveRequest = false;
      IVar35 = pIVar54->NavNextActivateId;
      if (IVar35 != 0) {
        pIVar54->NavActivateId = IVar35;
        pIVar54->NavActivateDownId = IVar35;
        pIVar54->NavActivatePressedId = IVar35;
        pIVar54->NavInputId = IVar35;
      }
      pIVar54->NavNextActivateId = 0;
      if (pIVar54->NavMoveRequestForward == ImGuiNavForward_None) {
        pIVar54->NavMoveDir = -1;
        pIVar54->NavMoveRequestFlags = 0;
        IVar39 = -1;
        if (((!bVar27) && (pIVar54->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
           ((pIVar34->Flags & 0x40000) == 0)) {
          uVar63 = GImGui->ActiveIdUsingNavDirMask;
          IVar39 = -1;
          if (((uVar63 & 1) == 0) &&
             ((fVar66 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar66 ||
              (fVar66 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar66)))) {
            pIVar54->NavMoveDir = 0;
            IVar39 = 0;
          }
          if (((uVar63 & 2) == 0) &&
             ((fVar66 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar66 ||
              (fVar66 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar66)))) {
            pIVar54->NavMoveDir = 1;
            IVar39 = 1;
          }
          if (((uVar63 & 4) == 0) &&
             ((fVar66 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar66 ||
              (fVar66 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar66)))) {
            pIVar54->NavMoveDir = 2;
            IVar39 = 2;
          }
          if (((uVar63 & 8) == 0) &&
             ((fVar66 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar66 ||
              (fVar66 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat), 0.0 < fVar66)))) {
            pIVar54->NavMoveDir = 3;
            IVar39 = 3;
          }
        }
        pIVar54->NavMoveClipDir = IVar39;
      }
      else {
        if ((pIVar54->NavMoveDir == -1) || (pIVar54->NavMoveClipDir == -1)) {
          __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x2549,"void ImGui::NavUpdate()");
        }
        if (pIVar54->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
          __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x254a,"void ImGui::NavUpdate()");
        }
        pIVar54->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
      }
      pIVar25 = GImGui;
      fVar66 = 0.0;
      if ((((((uVar60 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
           (pIVar34 = GImGui->NavWindow, pIVar34 != (ImGuiWindow *)0x0)) &&
          (((pIVar34->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0))))
         && (GImGui->NavLayer == ImGuiNavLayer_Main)) {
        bVar27 = IsKeyDown((GImGui->IO).KeyMap[5]);
        bVar28 = false;
        bVar29 = false;
        if (bVar27) {
          bVar29 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
        }
        bVar27 = IsKeyDown((pIVar25->IO).KeyMap[6]);
        if (bVar27) {
          bVar28 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
        }
        bVar27 = IsKeyPressed((pIVar25->IO).KeyMap[7],true);
        if (bVar27) {
          bVar27 = (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0;
        }
        else {
          bVar27 = false;
        }
        bVar30 = IsKeyPressed((pIVar25->IO).KeyMap[8],true);
        if (bVar30) {
          bVar30 = (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0;
        }
        else {
          bVar30 = false;
        }
        fVar66 = 0.0;
        if ((bVar29 != bVar28) || (bVar27 != bVar30)) {
          if (((pIVar34->DC).NavLayerActiveMask == 0) && ((pIVar34->DC).NavHasScroll == true)) {
            bVar28 = IsKeyPressed((pIVar25->IO).KeyMap[5],true);
            if (bVar28) {
              fVar66 = (pIVar34->Scroll).y -
                       ((pIVar34->InnerRect).Max.y - (pIVar34->InnerRect).Min.y);
LAB_00127d7a:
              (pIVar34->ScrollTarget).y = fVar66;
            }
            else {
              bVar28 = IsKeyPressed((pIVar25->IO).KeyMap[6],true);
              if (bVar28) {
                fVar66 = ((pIVar34->InnerRect).Max.y - (pIVar34->InnerRect).Min.y) +
                         (pIVar34->Scroll).y;
                goto LAB_00127d7a;
              }
              if (bVar27 == false) {
                if (bVar30 == false) goto LAB_00127d93;
                fVar66 = (pIVar34->ScrollMax).y;
                goto LAB_00127d7a;
              }
              (pIVar34->ScrollTarget).y = 0.0;
            }
            (pIVar34->ScrollTargetCenterRatio).y = 0.0;
            (pIVar34->ScrollTargetEdgeSnapDist).y = 0.0;
LAB_00127d93:
            fVar66 = 0.0;
          }
          else {
            IVar44 = pIVar25->NavLayer;
            pIVar40 = pIVar34->NavRectRel + IVar44;
            fVar66 = GImGui->FontBaseSize * pIVar34->FontWindowScale * pIVar34->FontDpiScale;
            if (pIVar34->ParentWindow != (ImGuiWindow *)0x0) {
              fVar66 = fVar66 * pIVar34->ParentWindow->FontWindowScale;
            }
            fVar66 = (pIVar34->NavRectRel[IVar44].Max.y - pIVar34->NavRectRel[IVar44].Min.y) +
                     (((pIVar34->InnerRect).Max.y - (pIVar34->InnerRect).Min.y) - fVar66);
            fVar66 = (float)(~-(uint)(fVar66 <= 0.0) & (uint)fVar66);
            bVar28 = IsKeyPressed((pIVar25->IO).KeyMap[5],true);
            if (bVar28) {
              fVar66 = -fVar66;
              pIVar25->NavMoveDir = 3;
              pIVar25->NavMoveClipDir = 2;
              pIVar25->NavMoveRequestFlags = 0x30;
            }
            else {
              bVar28 = IsKeyPressed((pIVar25->IO).KeyMap[6],true);
              if (!bVar28) {
                if (bVar27 == false) {
                  fVar66 = 0.0;
                  if (bVar30 != false) {
                    fVar84 = ((pIVar34->ScrollMax).y + (pIVar34->SizeFull).y) - (pIVar34->Scroll).y;
                    pIVar34->NavRectRel[IVar44].Max.y = fVar84;
                    pIVar34->NavRectRel[IVar44].Min.y = fVar84;
                    fVar84 = (pIVar40->Min).x;
                    pIVar1 = &pIVar34->NavRectRel[IVar44].Max;
                    if (pIVar1->x <= fVar84 && fVar84 != pIVar1->x) {
                      pIVar34->NavRectRel[IVar44].Max.x = 0.0;
                      (pIVar40->Min).x = 0.0;
                    }
                    pIVar25->NavMoveDir = 2;
                    pIVar25->NavMoveRequestFlags = 0x50;
                  }
                  goto LAB_001266ee;
                }
                fVar66 = -(pIVar34->Scroll).y;
                pIVar34->NavRectRel[IVar44].Max.y = fVar66;
                pIVar34->NavRectRel[IVar44].Min.y = fVar66;
                fVar66 = (pIVar40->Min).x;
                pIVar1 = &pIVar34->NavRectRel[IVar44].Max;
                if (pIVar1->x <= fVar66 && fVar66 != pIVar1->x) {
                  pIVar34->NavRectRel[IVar44].Max.x = 0.0;
                  (pIVar40->Min).x = 0.0;
                }
                pIVar25->NavMoveDir = 3;
                pIVar25->NavMoveRequestFlags = 0x50;
                goto LAB_00127d93;
              }
              pIVar25->NavMoveDir = 2;
              pIVar25->NavMoveClipDir = 3;
              pIVar25->NavMoveRequestFlags = 0x30;
            }
          }
        }
      }
LAB_001266ee:
      uVar60 = pIVar54->NavMoveDir;
      if (uVar60 == 0xffffffff) {
        bVar58 = pIVar54->NavMoveRequest;
        if ((bVar58 & 1) != 0) goto LAB_00126731;
        bVar27 = false;
      }
      else {
        pIVar54->NavMoveRequest = true;
        pIVar54->NavMoveRequestKeyMods = (pIVar54->IO).KeyMods;
        pIVar54->NavMoveDirLast = uVar60;
        bVar58 = 1;
LAB_00126731:
        bVar27 = true;
        if (pIVar54->NavId == 0) {
          pIVar54->NavInitRequest = true;
          pIVar54->NavInitRequestFromMove = true;
          pIVar54->NavInitResultId = 0;
          pIVar54->NavDisableHighlight = false;
        }
      }
      pIVar25 = GImGui;
      if (GImGui->NavMoveRequest == false) {
        pbVar53 = &GImGui->NavInitRequest;
        GImGui->NavAnyRequest = *pbVar53;
        if (*pbVar53 != false) goto LAB_00126849;
      }
      else {
        GImGui->NavAnyRequest = true;
LAB_00126849:
        if (pIVar25->NavWindow == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow != __null",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x2439,"void ImGui::NavUpdateAnyRequestFlag()");
        }
      }
      pIVar34 = pIVar54->NavWindow;
      if (((pIVar34 != (ImGuiWindow *)0x0) && ((pIVar34->Flags & 0x40000) == 0)) &&
         (pIVar54->NavWindowingTarget == (ImGuiWindow *)0x0)) {
        fVar84 = pIVar25->FontBaseSize * pIVar34->FontWindowScale * pIVar34->FontDpiScale;
        if (pIVar34->ParentWindow != (ImGuiWindow *)0x0) {
          fVar84 = fVar84 * pIVar34->ParentWindow->FontWindowScale;
        }
        fVar84 = (float)(int)(fVar84 * 100.0 * (pIVar54->IO).DeltaTime + 0.5);
        if (((pIVar34->DC).NavLayerActiveMask == 0) && ((bVar58 & (pIVar34->DC).NavHasScroll) == 1))
        {
          if (uVar60 < 2) {
            lVar52 = 0xac;
            lVar55 = 0xa4;
            lVar48 = 0x9c;
            lVar50 = 0x8c;
            uVar63 = 0;
          }
          else {
            if ((uVar60 & 0xfffffffe) != 2) goto LAB_00126a02;
            lVar52 = 0xb0;
            lVar55 = 0xa8;
            lVar48 = 0xa0;
            uVar63 = 2;
            lVar50 = 0x90;
          }
          *(float *)((long)&pIVar34->Name + lVar48) =
               (float)(int)(*(float *)(&DAT_0019d43c + (ulong)(uVar60 == uVar63) * 4) * fVar84 +
                           *(float *)((long)&pIVar34->Name + lVar50));
          *(undefined4 *)((long)&pIVar34->Name + lVar55) = 0;
          *(undefined4 *)((long)&pIVar34->Name + lVar52) = 0;
        }
LAB_00126a02:
        IVar67 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
        fVar91 = IVar67.x;
        fVar94 = IVar67.y;
        if (((fVar91 != 0.0) || (NAN(fVar91))) && (pIVar34->ScrollbarX == true)) {
          (pIVar34->ScrollTarget).x = (float)(int)(fVar91 * fVar84 + (pIVar34->Scroll).x);
          (pIVar34->ScrollTargetCenterRatio).x = 0.0;
          (pIVar34->ScrollTargetEdgeSnapDist).x = 0.0;
        }
        if ((fVar94 != 0.0) || (NAN(fVar94))) {
          (pIVar34->ScrollTarget).y = (float)(int)(fVar94 * fVar84 + (pIVar34->Scroll).y);
          (pIVar34->ScrollTargetCenterRatio).y = 0.0;
          (pIVar34->ScrollTargetEdgeSnapDist).y = 0.0;
        }
      }
      (pIVar54->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
      (pIVar54->NavMoveResultLocal).ID = 0;
      (pIVar54->NavMoveResultLocal).FocusScopeId = 0;
      (pIVar54->NavMoveResultLocal).DistAxial = 3.4028235e+38;
      (pIVar54->NavMoveResultLocal).DistBox = 3.4028235e+38;
      (pIVar54->NavMoveResultLocal).DistCenter = 3.4028235e+38;
      (pIVar54->NavMoveResultLocal).RectRel.Min.x = 0.0;
      (pIVar54->NavMoveResultLocal).RectRel.Min.y = 0.0;
      (pIVar54->NavMoveResultLocal).RectRel.Max.x = 0.0;
      (pIVar54->NavMoveResultLocal).RectRel.Max.y = 0.0;
      (pIVar54->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
      (pIVar54->NavMoveResultLocalVisibleSet).ID = 0;
      (pIVar54->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
      (pIVar54->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
      (pIVar54->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
      (pIVar54->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
      (pIVar54->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
      (pIVar54->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
      (pIVar54->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
      (pIVar54->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
      (pIVar54->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
      (pIVar54->NavMoveResultOther).ID = 0;
      (pIVar54->NavMoveResultOther).FocusScopeId = 0;
      (pIVar54->NavMoveResultOther).DistAxial = 3.4028235e+38;
      (pIVar54->NavMoveResultOther).DistBox = 3.4028235e+38;
      (pIVar54->NavMoveResultOther).DistCenter = 3.4028235e+38;
      (pIVar54->NavMoveResultOther).RectRel.Min.x = 0.0;
      (pIVar54->NavMoveResultOther).RectRel.Min.y = 0.0;
      (pIVar54->NavMoveResultOther).RectRel.Max.x = 0.0;
      (pIVar54->NavMoveResultOther).RectRel.Max.y = 0.0;
      if (((bVar27) && (pIVar54->NavInputSource == ImGuiInputSource_NavGamepad)) &&
         (pIVar54->NavLayer == ImGuiNavLayer_Main)) {
        fVar84 = (pIVar34->Pos).x;
        fVar91 = (pIVar34->Pos).y;
        auVar76._0_4_ = ((pIVar34->InnerRect).Min.x - fVar84) + -1.0;
        auVar76._4_4_ = ((pIVar34->InnerRect).Min.y - fVar91) + -1.0;
        auVar76._8_4_ = ((pIVar34->InnerRect).Max.x - fVar84) + 1.0;
        auVar76._12_4_ = ((pIVar34->InnerRect).Max.y - fVar91) + 1.0;
        if (((pIVar34->NavRectRel[0].Min.x < auVar76._0_4_) ||
            (pIVar34->NavRectRel[0].Min.y < auVar76._4_4_)) ||
           ((auVar76._8_4_ < pIVar34->NavRectRel[0].Max.x ||
            (auVar76._12_4_ < pIVar34->NavRectRel[0].Max.y)))) {
          fVar84 = pIVar25->FontBaseSize * pIVar34->FontWindowScale * pIVar34->FontDpiScale;
          if (pIVar34->ParentWindow != (ImGuiWindow *)0x0) {
            fVar84 = fVar84 * pIVar34->ParentWindow->FontWindowScale;
          }
          auVar88._0_4_ = fVar84 * 0.5;
          auVar82._0_4_ = auVar76._8_4_ - auVar76._0_4_;
          auVar82._4_4_ = auVar76._12_4_ - auVar76._4_4_;
          auVar82._8_4_ = auVar76._8_4_ - auVar76._8_4_;
          auVar82._12_4_ = auVar76._12_4_ - auVar76._12_4_;
          auVar88._4_4_ = auVar88._0_4_;
          auVar88._8_4_ = auVar88._0_4_;
          auVar88._12_4_ = auVar88._0_4_;
          auVar83 = minps(auVar82,auVar88);
          local_68.Min.x = auVar83._0_4_ + auVar76._0_4_;
          local_68.Min.y = auVar83._4_4_ + auVar76._4_4_;
          auVar23._4_8_ = auVar76._8_8_;
          auVar23._0_4_ = auVar76._4_4_ - auVar88._0_4_;
          auVar77._0_8_ = auVar23._0_8_ << 0x20;
          auVar77._8_4_ = auVar76._8_4_ - auVar83._0_4_;
          auVar77._12_4_ = auVar76._12_4_ - auVar83._4_4_;
          local_68.Max = auVar77._8_8_;
          ImRect::ClipWithFull(pIVar34->NavRectRel,&local_68);
          pIVar54->NavId = 0;
          pIVar54->NavFocusScopeId = 0;
          pIVar34 = pIVar54->NavWindow;
        }
      }
      if (pIVar34 == (ImGuiWindow *)0x0) {
        fVar91 = 1.0;
        fVar85 = 0.0;
        fVar84 = 0.0;
        fVar94 = 0.0;
      }
      else {
        IVar44 = pIVar54->NavLayer;
        fVar91 = pIVar34->NavRectRel[IVar44].Min.x;
        fVar93 = pIVar34->NavRectRel[IVar44].Max.x;
        fVar84 = 0.0;
        if (fVar93 < fVar91) {
          fVar94 = 0.0;
          fVar79 = 0.0;
          fVar85 = 0.0;
        }
        else {
          fVar7 = pIVar34->NavRectRel[IVar44].Min.y;
          fVar8 = pIVar34->NavRectRel[IVar44].Max.y;
          fVar79 = 0.0;
          fVar94 = 0.0;
          fVar85 = 0.0;
          if (fVar7 <= fVar8) {
            fVar84 = fVar8;
            fVar79 = fVar91;
            fVar94 = fVar93;
            fVar85 = fVar7;
          }
        }
        fVar91 = (pIVar34->Pos).x;
        fVar93 = (pIVar34->Pos).y;
        fVar85 = fVar85 + fVar93;
        fVar94 = fVar94 + fVar91;
        fVar84 = fVar84 + fVar93;
        fVar91 = fVar79 + fVar91 + 1.0;
      }
      if (fVar94 <= fVar91) {
        fVar91 = fVar94;
      }
      (pIVar54->NavScoringRect).Min.y = fVar85 + fVar66;
      (pIVar54->NavScoringRect).Max.y = fVar84 + fVar66;
      (pIVar54->NavScoringRect).Min.x = fVar91;
      (pIVar54->NavScoringRect).Max.x = fVar91;
      if (fVar84 + fVar66 < fVar85 + fVar66) {
        __assert_fail("!g.NavScoringRect.IsInverted()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x2599,"void ImGui::NavUpdate()");
      }
      pIVar54->NavScoringCount = 0;
      pIVar54 = GImGui;
      pIVar1 = &(GImGui->IO).MousePos;
      bVar27 = IsMousePosValid(pIVar1);
      if (bVar27) {
        IVar67 = (pIVar54->IO).MousePos;
        IVar68.x = (float)(int)IVar67.x;
        IVar68.y = (float)(int)IVar67.y;
        pIVar54->LastValidMousePos = IVar68;
        (pIVar54->IO).MousePos = IVar68;
      }
      bVar27 = IsMousePosValid(pIVar1);
      if ((bVar27) && (bVar27 = IsMousePosValid(&(pIVar54->IO).MousePosPrev), bVar27)) {
        IVar67 = (pIVar54->IO).MousePos;
        IVar68 = (pIVar54->IO).MousePosPrev;
        IVar69.x = IVar67.x - IVar68.x;
        IVar69.y = IVar67.y - IVar68.y;
        (pIVar54->IO).MouseDelta = IVar69;
        if ((((IVar69.x != 0.0) || (NAN(IVar69.x))) || (IVar69.y != 0.0)) || (NAN(IVar69.y))) {
          pIVar54->NavDisableMouseHover = false;
        }
      }
      else {
        (pIVar54->IO).MouseDelta.x = 0.0;
        (pIVar54->IO).MouseDelta.y = 0.0;
      }
      (pIVar54->IO).MousePosPrev = (pIVar54->IO).MousePos;
      lVar52 = 0;
      do {
        if ((pIVar54->IO).MouseDown[lVar52] == true) {
          fVar66 = (pIVar54->IO).MouseDownDuration[lVar52];
          pbVar53 = (pIVar54->IO).MouseClicked + lVar52;
          *pbVar53 = fVar66 < 0.0;
          pbVar53[10] = false;
          (pIVar54->IO).MouseDownDurationPrev[lVar52] = fVar66;
          if (0.0 <= fVar66) {
            (pIVar54->IO).MouseDownDuration[lVar52] = fVar66 + (pIVar54->IO).DeltaTime;
            (pIVar54->IO).MouseDoubleClicked[lVar52] = false;
            bVar27 = IsMousePosValid(pIVar1);
            auVar78 = ZEXT816(0);
            if (bVar27) {
              IVar67 = (pIVar54->IO).MousePos;
              IVar68 = (pIVar54->IO).MouseClickedPos[lVar52];
              auVar78._0_4_ = IVar67.x - IVar68.x;
              auVar78._4_4_ = IVar67.y - IVar68.y;
              auVar78._8_8_ = 0;
            }
            fVar66 = (pIVar54->IO).MouseDragMaxDistanceSqr[lVar52];
            fVar84 = auVar78._0_4_ * auVar78._0_4_ + auVar78._4_4_ * auVar78._4_4_;
            uVar60 = -(uint)(fVar84 <= fVar66);
            (pIVar54->IO).MouseDragMaxDistanceSqr[lVar52] =
                 (float)(~uVar60 & (uint)fVar84 | (uint)fVar66 & uVar60);
            IVar67 = (pIVar54->IO).MouseDragMaxDistanceAbs[lVar52];
            auVar89._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
            auVar89._8_4_ = auVar78._8_4_ ^ 0x80000000;
            auVar89._12_4_ = auVar78._12_4_ ^ 0x80000000;
            auVar83 = maxps(auVar89,auVar78);
            fVar66 = IVar67.x;
            fVar84 = IVar67.y;
            uVar60 = -(uint)(auVar83._0_4_ <= fVar66);
            uVar63 = -(uint)(auVar83._4_4_ <= fVar84);
            pIVar6 = (pIVar54->IO).MouseDragMaxDistanceAbs + lVar52;
            pIVar6->x = (float)(~uVar60 & (uint)auVar83._0_4_ | (uint)fVar66 & uVar60);
            pIVar6->y = (float)(~uVar63 & (uint)auVar83._4_4_ | (uint)fVar84 & uVar63);
          }
          else {
            (pIVar54->IO).MouseDownDuration[lVar52] = 0.0;
            (pIVar54->IO).MouseDoubleClicked[lVar52] = false;
            dVar70 = pIVar54->Time;
            if ((float)(dVar70 - (pIVar54->IO).MouseClickedTime[lVar52]) <
                (pIVar54->IO).MouseDoubleClickTime) {
              bVar27 = IsMousePosValid(pIVar1);
              fVar66 = 0.0;
              fVar84 = 0.0;
              if (bVar27) {
                IVar67 = (pIVar54->IO).MousePos;
                IVar68 = (pIVar54->IO).MouseClickedPos[lVar52];
                fVar66 = IVar67.x - IVar68.x;
                fVar84 = IVar67.y - IVar68.y;
              }
              fVar91 = (pIVar54->IO).MouseDoubleClickMaxDist;
              if (fVar66 * fVar66 + fVar84 * fVar84 < fVar91 * fVar91) {
                (pIVar54->IO).MouseDoubleClicked[lVar52] = true;
              }
              dVar70 = (double)((pIVar54->IO).MouseDoubleClickTime * -2.0);
            }
            (pIVar54->IO).MouseClickedTime[lVar52] = dVar70;
            (pIVar54->IO).MouseClickedPos[lVar52] = (pIVar54->IO).MousePos;
            (pIVar54->IO).MouseDownWasDoubleClick[lVar52] = (pIVar54->IO).MouseDoubleClicked[lVar52]
            ;
            pIVar6 = (pIVar54->IO).MouseDragMaxDistanceAbs + lVar52;
            pIVar6->x = 0.0;
            pIVar6->y = 0.0;
            (pIVar54->IO).MouseDragMaxDistanceSqr[lVar52] = 0.0;
          }
        }
        else {
          (pIVar54->IO).MouseClicked[lVar52] = false;
          fVar66 = (pIVar54->IO).MouseDownDuration[lVar52];
          (pIVar54->IO).MouseReleased[lVar52] = 0.0 <= fVar66;
          pbVar53 = (pIVar54->IO).MouseClicked + lVar52;
          (pIVar54->IO).MouseDownDurationPrev[lVar52] = fVar66;
          (pIVar54->IO).MouseDownDuration[lVar52] = -1.0;
          (pIVar54->IO).MouseDoubleClicked[lVar52] = false;
        }
        if (((pIVar54->IO).MouseDown[lVar52] == false) &&
           ((pIVar54->IO).MouseReleased[lVar52] == false)) {
          (pIVar54->IO).MouseDownWasDoubleClick[lVar52] = false;
        }
        if (*pbVar53 == true) {
          pIVar54->NavDisableMouseHover = false;
        }
        lVar52 = lVar52 + 1;
      } while (lVar52 != 5);
      DockContextUpdateUndocking(ctx_00);
      UpdateHoveredWindowAndCaptureFlags();
      UpdateMouseMovingWindowNewFrame();
      pIVar34 = GetTopMostPopupModal();
      if ((pIVar34 != (ImGuiWindow *)0x0) ||
         ((ctx_00->NavWindowingTarget != (ImGuiWindow *)0x0 &&
          (0.0 < ctx_00->NavWindowingHighlightAlpha)))) {
        fVar66 = (ctx_00->IO).DeltaTime * 6.0 + ctx_00->DimBgRatio;
        if (1.0 <= fVar66) {
          fVar66 = 1.0;
        }
        ctx_00->DimBgRatio = fVar66;
      }
      else {
        fVar66 = (ctx_00->IO).DeltaTime * -10.0 + ctx_00->DimBgRatio;
        ctx_00->DimBgRatio = (float)(-(uint)(0.0 <= fVar66) & (uint)fVar66);
      }
      ctx_00->MouseCursor = 0;
      ctx_00->WantTextInputNextFrame = -1;
      ctx_00->WantCaptureMouseNextFrame = -1;
      ctx_00->WantCaptureKeyboardNextFrame = -1;
      (ctx_00->PlatformImePos).x = 1.0;
      (ctx_00->PlatformImePos).y = 1.0;
      ctx_00->PlatformImePosViewport = (ImGuiViewportP *)0x0;
      pIVar54 = GImGui;
      if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
        GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
        bVar27 = IsMousePosValid((ImVec2 *)0x0);
        if (((bVar27) &&
            (fVar66 = (pIVar54->IO).MouseDragThreshold,
            fVar84 = (pIVar54->IO).MousePos.x - (pIVar54->WheelingWindowRefMousePos).x,
            fVar91 = (pIVar54->IO).MousePos.y - (pIVar54->WheelingWindowRefMousePos).y,
            fVar66 * fVar66 < fVar84 * fVar84 + fVar91 * fVar91)) ||
           (pIVar54->WheelingWindowTimer <= 0.0)) {
          pIVar54->WheelingWindow = (ImGuiWindow *)0x0;
          pIVar54->WheelingWindowTimer = 0.0;
        }
      }
      pIVar25 = GImGui;
      fVar66 = (pIVar54->IO).MouseWheel;
      if (((((fVar66 != 0.0) || (fVar84 = (pIVar54->IO).MouseWheelH, fVar84 != 0.0)) ||
           (NAN(fVar84))) &&
          ((pIVar34 = pIVar54->WheelingWindow, pIVar34 != (ImGuiWindow *)0x0 ||
           (pIVar34 = pIVar54->HoveredWindow, pIVar34 != (ImGuiWindow *)0x0)))) &&
         (pIVar34->Collapsed == false)) {
        if ((fVar66 != 0.0) || (NAN(fVar66))) {
          if ((pIVar54->IO).KeyCtrl == true) {
            if ((pIVar54->IO).FontAllowUserScaling == true) {
              if (GImGui->WheelingWindow != pIVar34) {
                GImGui->WheelingWindow = pIVar34;
                pIVar25->WheelingWindowRefMousePos = (pIVar25->IO).MousePos;
                pIVar25->WheelingWindowTimer = 2.0;
                fVar66 = (pIVar54->IO).MouseWheel;
              }
              fVar84 = pIVar34->FontWindowScale;
              fVar91 = fVar66 * 0.1 + fVar84;
              fVar66 = 2.5;
              if (fVar91 <= 2.5) {
                fVar66 = fVar91;
              }
              fVar66 = (float)(-(uint)(fVar91 < 0.5) & 0x3f000000 |
                              ~-(uint)(fVar91 < 0.5) & (uint)fVar66);
              pIVar34->FontWindowScale = fVar66;
              if ((pIVar34->Flags & 0x1000000) == 0) {
                fVar66 = fVar66 / fVar84;
                IVar67 = pIVar34->Size;
                auVar90._8_8_ = 0;
                auVar90._0_4_ = IVar67.x;
                auVar90._4_4_ = IVar67.y;
                IVar68 = (pIVar54->IO).MousePos;
                fVar84 = (pIVar34->Pos).x;
                fVar91 = (pIVar34->Pos).y;
                auVar92._0_4_ = (IVar68.x - fVar84) * (1.0 - fVar66) * IVar67.x;
                auVar92._4_4_ = (IVar68.y - fVar91) * (1.0 - fVar66) * IVar67.y;
                auVar92._8_8_ = 0;
                auVar83 = divps(auVar92,auVar90);
                local_68.Min.x = auVar83._0_4_ + fVar84;
                local_68.Min.y = auVar83._4_4_ + fVar91;
                SetWindowPos(pIVar34,&local_68.Min,0);
                IVar71.x = (float)(int)((pIVar34->Size).x * fVar66);
                IVar71.y = (float)(int)((pIVar34->Size).y * fVar66);
                IVar80.x = (float)(int)((pIVar34->SizeFull).x * fVar66);
                IVar80.y = (float)(int)((pIVar34->SizeFull).y * fVar66);
                pIVar34->Size = IVar71;
                pIVar34->SizeFull = IVar80;
              }
              goto LAB_001271c8;
            }
          }
          else if ((pIVar54->IO).KeyShift == false) {
            if (GImGui->WheelingWindow != pIVar34) {
              GImGui->WheelingWindow = pIVar34;
              pIVar25->WheelingWindowRefMousePos = (pIVar25->IO).MousePos;
              pIVar25->WheelingWindowTimer = 2.0;
            }
            uVar60 = pIVar34->Flags;
            while (((uVar60 >> 0x18 & 1) != 0 &&
                   (((uVar60 & 0x210) == 0x10 ||
                    ((fVar84 = (pIVar34->ScrollMax).y, fVar84 == 0.0 && (!NAN(fVar84)))))))) {
              pIVar34 = pIVar34->ParentWindow;
              uVar60 = pIVar34->Flags;
            }
            if ((uVar60 & 0x210) == 0) {
              fVar84 = ((pIVar34->InnerRect).Max.y - (pIVar34->InnerRect).Min.y) * 0.67;
              fVar91 = pIVar25->FontBaseSize * pIVar34->FontWindowScale * pIVar34->FontDpiScale;
              if (pIVar34->ParentWindow != (ImGuiWindow *)0x0) {
                fVar91 = fVar91 * pIVar34->ParentWindow->FontWindowScale;
              }
              fVar94 = fVar91 * 5.0;
              if (fVar84 <= fVar91 * 5.0) {
                fVar94 = fVar84;
              }
              (pIVar34->ScrollTarget).y = (pIVar34->Scroll).y - fVar66 * (float)(int)fVar94;
              (pIVar34->ScrollTargetCenterRatio).y = 0.0;
              (pIVar34->ScrollTargetEdgeSnapDist).y = 0.0;
            }
          }
        }
        pIVar25 = GImGui;
        fVar66 = (pIVar54->IO).MouseWheelH;
        if (((fVar66 == 0.0) && (!NAN(fVar66))) || ((pIVar54->IO).KeyShift == true)) {
          fVar66 = (pIVar54->IO).MouseWheel;
          if (((fVar66 == 0.0) && (!NAN(fVar66))) || ((pIVar54->IO).KeyShift != true))
          goto LAB_001271c8;
        }
        if ((pIVar54->IO).KeyCtrl == false) {
          if (GImGui->WheelingWindow != pIVar34) {
            GImGui->WheelingWindow = pIVar34;
            pIVar25->WheelingWindowRefMousePos = (pIVar25->IO).MousePos;
            pIVar25->WheelingWindowTimer = 2.0;
          }
          uVar60 = pIVar34->Flags;
          while (((uVar60 >> 0x18 & 1) != 0 &&
                 (((uVar60 & 0x210) == 0x10 ||
                  ((fVar84 = (pIVar34->ScrollMax).x, fVar84 == 0.0 && (!NAN(fVar84)))))))) {
            pIVar34 = pIVar34->ParentWindow;
            uVar60 = pIVar34->Flags;
          }
          if ((uVar60 & 0x210) == 0) {
            fVar84 = ((pIVar34->InnerRect).Max.x - (pIVar34->InnerRect).Min.x) * 0.67;
            fVar91 = pIVar25->FontBaseSize * pIVar34->FontWindowScale * pIVar34->FontDpiScale;
            if (pIVar34->ParentWindow != (ImGuiWindow *)0x0) {
              fVar91 = fVar91 * pIVar34->ParentWindow->FontWindowScale;
            }
            fVar94 = fVar91 + fVar91;
            if (fVar84 <= fVar91 + fVar91) {
              fVar94 = fVar84;
            }
            (pIVar34->ScrollTarget).x = (pIVar34->Scroll).x - fVar66 * (float)(int)fVar94;
            (pIVar34->ScrollTargetCenterRatio).x = 0.0;
            (pIVar34->ScrollTargetEdgeSnapDist).x = 0.0;
          }
        }
      }
LAB_001271c8:
      pIVar54 = GImGui;
      pIVar34 = GImGui->NavWindow;
      if ((((pIVar34 == (ImGuiWindow *)0x0) || (pIVar34->Active != true)) ||
          ((pIVar34->Flags & 0x40000) != 0)) ||
         (((GImGui->IO).KeyCtrl != false || (iVar59 = (GImGui->IO).KeyMap[0], iVar59 < 0)))) {
        GImGui->FocusTabPressed = false;
      }
      else {
        bVar27 = IsKeyPressed(iVar59,true);
        pIVar54->FocusTabPressed = bVar27;
        if ((bVar27) && (pIVar54->ActiveId == 0)) {
          pIVar34 = pIVar54->NavWindow;
          pIVar54->FocusRequestNextWindow = pIVar34;
          pIVar54->FocusRequestNextCounterRegular = 0x7fffffff;
          if ((pIVar54->NavId == 0) || (pIVar54->NavIdTabCounter == 0x7fffffff)) {
            iVar59 = -(uint)(pIVar54->IO).KeyShift;
          }
          else {
            iVar59 = pIVar54->NavIdTabCounter + (-(uint)(pIVar54->IO).KeyShift | 1) + 1;
          }
          pIVar54->FocusRequestNextCounterTabStop = iVar59;
          goto LAB_00127272;
        }
      }
      pIVar34 = pIVar54->FocusRequestNextWindow;
LAB_00127272:
      pIVar54->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
      pIVar54->FocusRequestCurrCounterRegular = 0x7fffffff;
      pIVar54->FocusRequestCurrCounterTabStop = 0x7fffffff;
      if (pIVar34 != (ImGuiWindow *)0x0) {
        pIVar54->FocusRequestCurrWindow = pIVar34;
        if ((pIVar54->FocusRequestNextCounterRegular != 0x7fffffff) &&
           (iVar59 = (pIVar34->DC).FocusCounterRegular, iVar59 != -1)) {
          pIVar54->FocusRequestCurrCounterRegular =
               (pIVar54->FocusRequestNextCounterRegular + iVar59 + 1) % (iVar59 + 1);
        }
        if ((pIVar54->FocusRequestNextCounterTabStop != 0x7fffffff) &&
           (iVar59 = (pIVar34->DC).FocusCounterTabStop, iVar59 != -1)) {
          pIVar54->FocusRequestCurrCounterTabStop =
               (pIVar54->FocusRequestNextCounterTabStop + iVar59 + 1) % (iVar59 + 1);
        }
        pIVar54->FocusRequestNextWindow = (ImGuiWindow *)0x0;
        pIVar54->FocusRequestNextCounterRegular = 0x7fffffff;
        pIVar54->FocusRequestNextCounterTabStop = 0x7fffffff;
      }
      pIVar54->NavIdTabCounter = 0x7fffffff;
      uVar60 = (ctx_00->WindowsFocusOrder).Size;
      if (uVar60 != (ctx_00->Windows).Size) {
        __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0xfea,"void ImGui::NewFrame()");
      }
      fVar66 = (ctx_00->IO).ConfigWindowsMemoryCompactTimer;
      if (0.0 <= fVar66) {
        fVar66 = (float)ctx_00->Time - fVar66;
      }
      else {
        fVar66 = 3.4028235e+38;
      }
      if (uVar60 != 0) {
        uVar57 = 0;
        do {
          if ((long)(int)uVar60 <= (long)uVar57) goto LAB_00127ddd;
          pIVar34 = (ctx_00->Windows).Data[uVar57];
          bVar27 = pIVar34->Active;
          pIVar34->WasActive = bVar27;
          pIVar34->BeginCount = 0;
          pIVar34->Active = false;
          pIVar34->WriteAccessed = false;
          if (((bVar27 == false) && (pIVar34->MemoryCompacted == false)) &&
             (pIVar34->LastTimeActive <= fVar66 && fVar66 != pIVar34->LastTimeActive)) {
            GcCompactTransientWindowBuffers(pIVar34);
            uVar60 = (ctx_00->Windows).Size;
          }
          uVar57 = uVar57 + 1;
        } while (uVar57 != uVar60);
      }
      if ((ctx_00->NavWindow != (ImGuiWindow *)0x0) && (ctx_00->NavWindow->WasActive == false)) {
        FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
      }
      if ((ctx_00->CurrentWindowStack).Capacity < 0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar4 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar4 = *piVar4 + 1;
        }
        __dest_00 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
        ppIVar16 = (ctx_00->CurrentWindowStack).Data;
        if (ppIVar16 != (ImGuiWindow **)0x0) {
          memcpy(__dest_00,ppIVar16,(long)(ctx_00->CurrentWindowStack).Size << 3);
          ppIVar16 = (ctx_00->CurrentWindowStack).Data;
          if ((ppIVar16 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar4 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar4 = *piVar4 + -1;
          }
          (*GImAllocatorFreeFunc)(ppIVar16,GImAllocatorUserData);
        }
        (ctx_00->CurrentWindowStack).Data = __dest_00;
        (ctx_00->CurrentWindowStack).Capacity = 0;
      }
      (ctx_00->CurrentWindowStack).Size = 0;
      if ((ctx_00->BeginPopupStack).Capacity < 0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar4 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar4 = *piVar4 + 1;
        }
        __dest_01 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
        pIVar21 = (ctx_00->BeginPopupStack).Data;
        if (pIVar21 != (ImGuiPopupData *)0x0) {
          memcpy(__dest_01,pIVar21,(long)(ctx_00->BeginPopupStack).Size * 0x30);
          pIVar21 = (ctx_00->BeginPopupStack).Data;
          if ((pIVar21 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar4 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar4 = *piVar4 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar21,GImAllocatorUserData);
        }
        (ctx_00->BeginPopupStack).Data = __dest_01;
        (ctx_00->BeginPopupStack).Capacity = 0;
      }
      (ctx_00->BeginPopupStack).Size = 0;
      ClosePopupsOverWindow(ctx_00->NavWindow,false);
      DockContextUpdateDocking(ctx_00);
      pIVar54 = GImGui;
      GImGui->DebugItemPickerBreakId = 0;
      if (pIVar54->DebugItemPickerActive == true) {
        uVar60 = pIVar54->HoveredIdPreviousFrame;
        pIVar54->MouseCursor = 7;
        iVar59 = (pIVar54->IO).KeyMap[0xe];
        if ((-1 < iVar59) && (bVar27 = IsKeyPressed(iVar59,true), bVar27)) {
          pIVar54->DebugItemPickerActive = false;
        }
        pIVar25 = GImGui;
        fVar66 = (GImGui->IO).MouseDownDuration[0];
        if ((fVar66 != 0.0) || (NAN(fVar66))) {
          uVar63 = (uint)(uVar60 == 0);
        }
        else if (uVar60 == 0) {
          uVar63 = 1;
        }
        else {
          pIVar54->DebugItemPickerBreakId = uVar60;
          pIVar54->DebugItemPickerActive = false;
          uVar63 = 0;
        }
        pIVar3 = &pIVar25->NextWindowData;
        *(byte *)&pIVar3->Flags = (byte)pIVar3->Flags | 0x40;
        (pIVar25->NextWindowData).BgAlphaVal = 0.6;
        BeginTooltipEx(0,0);
        Text("HoveredId: 0x%08X",(ulong)uVar60);
        Text("Press ESC to abort picking.");
        TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar63 << 4)),
                    "Click to break in debugger!");
        EndTooltip();
        pIVar54 = GImGui;
      }
      ctx_00->WithinFrameScopeWithImplicitWindow = true;
      *(byte *)&(pIVar54->NextWindowData).Flags = (byte)(pIVar54->NextWindowData).Flags | 2;
      (pIVar54->NextWindowData).SizeVal.x = 400.0;
      (pIVar54->NextWindowData).SizeVal.y = 400.0;
      (pIVar54->NextWindowData).SizeCond = 4;
      Begin("Debug##Default",(bool *)0x0,0);
      if (ctx_00->CurrentWindow->IsFallbackWindow != false) {
        iVar59 = (ctx_00->Hooks).Size;
        if (0 < iVar59) {
          lVar52 = 0;
          lVar55 = 0;
          do {
            pIVar11 = (ctx_00->Hooks).Data;
            if (*(int *)(pIVar11 + lVar52) == 1) {
              (**(code **)(pIVar11 + lVar52 + 8))(ctx_00,pIVar11 + lVar52);
              iVar59 = (ctx_00->Hooks).Size;
            }
            lVar55 = lVar55 + 1;
            lVar52 = lVar52 + 0x18;
          } while (lVar55 < iVar59);
        }
        return;
      }
      __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x100f,"void ImGui::NewFrame()");
    }
  }
LAB_00127e13:
  pcVar37 = "T &ImVector<ImGuiViewportP *>::operator[](int) [T = ImGuiViewportP *]";
LAB_00127e28:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                ,0x5c2,pcVar37);
LAB_00127ddd:
  pcVar37 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
  goto LAB_00127e28;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    g.ConfigFlagsLastFrame = g.ConfigFlagsCurrFrame;
    ErrorCheckNewFrameSanityChecks();
    g.ConfigFlagsCurrFrame = g.IO.ConfigFlags;

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    // FIXME-VIEWPORT: the concept of a single ClipRectFullscreen is not ideal!
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(virtual_space.Min.x, virtual_space.Min.y, virtual_space.Max.x, virtual_space.Max.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleSegmentMaxError(g.Style.CircleSegmentMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawData = NULL;
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Undocking
    // (needs to be before UpdateMouseMovingWindowNewFrame so the window is already offset and following the mouse on the detaching frame)
    DockContextUpdateUndocking(&g);

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default
    g.PlatformImePosViewport = NULL;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.IO.ConfigWindowsMemoryCompactTimer >= 0.0f) ? (float)g.Time - g.IO.ConfigWindowsMemoryCompactTimer : FLT_MAX;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // Docking
    DockContextUpdateDocking(&g);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}